

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_h<embree::avx512::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  byte bVar63;
  ulong uVar64;
  byte bVar65;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong uVar66;
  long lVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  ulong uVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar123;
  uint uVar124;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar125;
  uint uVar129;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float pp;
  float fVar130;
  undefined4 uVar131;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar132;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar133 [16];
  undefined1 auVar141 [32];
  undefined1 auVar134 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [28];
  undefined1 auVar231 [64];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8f8;
  undefined2 local_8f2;
  ulong local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8b0 [8];
  float fStack_8a8;
  float fStack_8a4;
  RTCFilterFunctionNArguments local_8a0;
  undefined4 local_86c;
  uint local_868;
  int local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_610;
  float local_608;
  float local_604;
  undefined4 local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  Primitive *local_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar114 [32];
  
  PVar8 = prim[1];
  uVar70 = (ulong)(byte)PVar8;
  fVar147 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar81 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  fVar190 = fVar147 * auVar81._0_4_;
  fVar130 = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar76);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar73);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar77);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar94 = vpmovsxbd_avx2(auVar79);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar94);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar70 + 6);
  auVar86 = vpmovsxbd_avx2(auVar78);
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar66 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar91 = vpmovsxbd_avx2(auVar74);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar66 + uVar70 + 6);
  auVar92 = vpmovsxbd_avx2(auVar80);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar64 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar64 + 6);
  auVar84 = vpmovsxbd_avx2(auVar7);
  auVar93 = vcvtdq2ps_avx(auVar84);
  auVar104._4_4_ = fVar130;
  auVar104._0_4_ = fVar130;
  auVar104._8_4_ = fVar130;
  auVar104._12_4_ = fVar130;
  auVar104._16_4_ = fVar130;
  auVar104._20_4_ = fVar130;
  auVar104._24_4_ = fVar130;
  auVar104._28_4_ = fVar130;
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = ZEXT1632(CONCAT412(fVar147 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar147 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar147 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar130))));
  auVar95 = vpermps_avx2(auVar106,auVar96);
  auVar83 = vpermps_avx512vl(auVar82,auVar96);
  fVar130 = auVar83._0_4_;
  fVar158 = auVar83._4_4_;
  auVar96._4_4_ = fVar158 * auVar88._4_4_;
  auVar96._0_4_ = fVar130 * auVar88._0_4_;
  fVar160 = auVar83._8_4_;
  auVar96._8_4_ = fVar160 * auVar88._8_4_;
  fVar132 = auVar83._12_4_;
  auVar96._12_4_ = fVar132 * auVar88._12_4_;
  fVar162 = auVar83._16_4_;
  auVar96._16_4_ = fVar162 * auVar88._16_4_;
  fVar164 = auVar83._20_4_;
  auVar96._20_4_ = fVar164 * auVar88._20_4_;
  fVar166 = auVar83._24_4_;
  auVar96._24_4_ = fVar166 * auVar88._24_4_;
  auVar96._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar86._4_4_ * fVar158;
  auVar94._0_4_ = auVar86._0_4_ * fVar130;
  auVar94._8_4_ = auVar86._8_4_ * fVar160;
  auVar94._12_4_ = auVar86._12_4_ * fVar132;
  auVar94._16_4_ = auVar86._16_4_ * fVar162;
  auVar94._20_4_ = auVar86._20_4_ * fVar164;
  auVar94._24_4_ = auVar86._24_4_ * fVar166;
  auVar94._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar93._4_4_ * fVar158;
  auVar84._0_4_ = auVar93._0_4_ * fVar130;
  auVar84._8_4_ = auVar93._8_4_ * fVar160;
  auVar84._12_4_ = auVar93._12_4_ * fVar132;
  auVar84._16_4_ = auVar93._16_4_ * fVar162;
  auVar84._20_4_ = auVar93._20_4_ * fVar164;
  auVar84._24_4_ = auVar93._24_4_ * fVar166;
  auVar84._28_4_ = auVar83._28_4_;
  auVar75 = vfmadd231ps_fma(auVar96,auVar95,auVar85);
  auVar76 = vfmadd231ps_fma(auVar94,auVar95,auVar90);
  auVar73 = vfmadd231ps_fma(auVar84,auVar92,auVar95);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar104,auVar87);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,auVar89);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar91,auVar104);
  auVar207._4_4_ = fVar190;
  auVar207._0_4_ = fVar190;
  auVar207._8_4_ = fVar190;
  auVar207._12_4_ = fVar190;
  auVar207._16_4_ = fVar190;
  auVar207._20_4_ = fVar190;
  auVar207._24_4_ = fVar190;
  auVar207._28_4_ = fVar190;
  auVar84 = ZEXT1632(CONCAT412(fVar147 * auVar81._12_4_,
                               CONCAT48(fVar147 * auVar81._8_4_,
                                        CONCAT44(fVar147 * auVar81._4_4_,fVar190))));
  auVar94 = vpermps_avx2(auVar106,auVar84);
  auVar84 = vpermps_avx512vl(auVar82,auVar84);
  fVar147 = auVar84._0_4_;
  fVar130 = auVar84._4_4_;
  auVar95._4_4_ = fVar130 * auVar88._4_4_;
  auVar95._0_4_ = fVar147 * auVar88._0_4_;
  fVar158 = auVar84._8_4_;
  auVar95._8_4_ = fVar158 * auVar88._8_4_;
  fVar160 = auVar84._12_4_;
  auVar95._12_4_ = fVar160 * auVar88._12_4_;
  fVar132 = auVar84._16_4_;
  auVar95._16_4_ = fVar132 * auVar88._16_4_;
  fVar162 = auVar84._20_4_;
  auVar95._20_4_ = fVar162 * auVar88._20_4_;
  fVar164 = auVar84._24_4_;
  auVar95._24_4_ = fVar164 * auVar88._24_4_;
  auVar95._28_4_ = 1;
  auVar82._4_4_ = auVar86._4_4_ * fVar130;
  auVar82._0_4_ = auVar86._0_4_ * fVar147;
  auVar82._8_4_ = auVar86._8_4_ * fVar158;
  auVar82._12_4_ = auVar86._12_4_ * fVar160;
  auVar82._16_4_ = auVar86._16_4_ * fVar132;
  auVar82._20_4_ = auVar86._20_4_ * fVar162;
  auVar82._24_4_ = auVar86._24_4_ * fVar164;
  auVar82._28_4_ = auVar88._28_4_;
  auVar86._4_4_ = auVar93._4_4_ * fVar130;
  auVar86._0_4_ = auVar93._0_4_ * fVar147;
  auVar86._8_4_ = auVar93._8_4_ * fVar158;
  auVar86._12_4_ = auVar93._12_4_ * fVar160;
  auVar86._16_4_ = auVar93._16_4_ * fVar132;
  auVar86._20_4_ = auVar93._20_4_ * fVar162;
  auVar86._24_4_ = auVar93._24_4_ * fVar164;
  auVar86._28_4_ = auVar84._28_4_;
  auVar77 = vfmadd231ps_fma(auVar95,auVar94,auVar85);
  auVar79 = vfmadd231ps_fma(auVar82,auVar94,auVar90);
  auVar78 = vfmadd231ps_fma(auVar86,auVar94,auVar92);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar207,auVar87);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar207,auVar89);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar207,auVar91);
  auVar87 = vandps_avx(ZEXT1632(auVar75),auVar101);
  auVar103._8_4_ = 0x219392ef;
  auVar103._0_8_ = 0x219392ef219392ef;
  auVar103._12_4_ = 0x219392ef;
  auVar103._16_4_ = 0x219392ef;
  auVar103._20_4_ = 0x219392ef;
  auVar103._24_4_ = 0x219392ef;
  auVar103._28_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar87,auVar103,1);
  bVar13 = (bool)((byte)uVar66 & 1);
  auVar83._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar75._0_4_;
  bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar75._4_4_;
  bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar75._8_4_;
  bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar75._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar76),auVar101);
  uVar66 = vcmpps_avx512vl(auVar87,auVar103,1);
  bVar13 = (bool)((byte)uVar66 & 1);
  auVar97._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar76._0_4_;
  bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar76._4_4_;
  bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar76._8_4_;
  bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar76._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar73),auVar101);
  uVar66 = vcmpps_avx512vl(auVar87,auVar103,1);
  bVar13 = (bool)((byte)uVar66 & 1);
  auVar87._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar73._0_4_;
  bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar73._4_4_;
  bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar73._8_4_;
  bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar73._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = 0x3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar83,auVar85,auVar102);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar97);
  auVar76 = vfnmadd213ps_fma(auVar97,auVar85,auVar102);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar73 = vfnmadd213ps_fma(auVar87,auVar85,auVar102);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar85,auVar85);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar77));
  auVar91._4_4_ = auVar75._4_4_ * auVar87._4_4_;
  auVar91._0_4_ = auVar75._0_4_ * auVar87._0_4_;
  auVar91._8_4_ = auVar75._8_4_ * auVar87._8_4_;
  auVar91._12_4_ = auVar75._12_4_ * auVar87._12_4_;
  auVar91._16_4_ = auVar87._16_4_ * 0.0;
  auVar91._20_4_ = auVar87._20_4_ * 0.0;
  auVar91._24_4_ = auVar87._24_4_ * 0.0;
  auVar91._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar77));
  auVar86 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar100._0_4_ = auVar75._0_4_ * auVar87._0_4_;
  auVar100._4_4_ = auVar75._4_4_ * auVar87._4_4_;
  auVar100._8_4_ = auVar75._8_4_ * auVar87._8_4_;
  auVar100._12_4_ = auVar75._12_4_ * auVar87._12_4_;
  auVar100._16_4_ = auVar87._16_4_ * 0.0;
  auVar100._20_4_ = auVar87._20_4_ * 0.0;
  auVar100._24_4_ = auVar87._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar70 * -2 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar79));
  auVar92._4_4_ = auVar76._4_4_ * auVar87._4_4_;
  auVar92._0_4_ = auVar76._0_4_ * auVar87._0_4_;
  auVar92._8_4_ = auVar76._8_4_ * auVar87._8_4_;
  auVar92._12_4_ = auVar76._12_4_ * auVar87._12_4_;
  auVar92._16_4_ = auVar87._16_4_ * 0.0;
  auVar92._20_4_ = auVar87._20_4_ * 0.0;
  auVar92._24_4_ = auVar87._24_4_ * 0.0;
  auVar92._28_4_ = auVar87._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar85);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar79));
  auVar99._0_4_ = auVar76._0_4_ * auVar87._0_4_;
  auVar99._4_4_ = auVar76._4_4_ * auVar87._4_4_;
  auVar99._8_4_ = auVar76._8_4_ * auVar87._8_4_;
  auVar99._12_4_ = auVar76._12_4_ * auVar87._12_4_;
  auVar99._16_4_ = auVar87._16_4_ * 0.0;
  auVar99._20_4_ = auVar87._20_4_ * 0.0;
  auVar99._24_4_ = auVar87._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 + uVar70 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar78));
  auVar93._4_4_ = auVar87._4_4_ * auVar73._4_4_;
  auVar93._0_4_ = auVar87._0_4_ * auVar73._0_4_;
  auVar93._8_4_ = auVar87._8_4_ * auVar73._8_4_;
  auVar93._12_4_ = auVar87._12_4_ * auVar73._12_4_;
  auVar93._16_4_ = auVar87._16_4_ * 0.0;
  auVar93._20_4_ = auVar87._20_4_ * 0.0;
  auVar93._24_4_ = auVar87._24_4_ * 0.0;
  auVar93._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar78));
  auVar98._0_4_ = auVar73._0_4_ * auVar87._0_4_;
  auVar98._4_4_ = auVar73._4_4_ * auVar87._4_4_;
  auVar98._8_4_ = auVar73._8_4_ * auVar87._8_4_;
  auVar98._12_4_ = auVar73._12_4_ * auVar87._12_4_;
  auVar98._16_4_ = auVar87._16_4_ * 0.0;
  auVar98._20_4_ = auVar87._20_4_ * 0.0;
  auVar98._24_4_ = auVar87._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar87 = vpminsd_avx2(auVar91,auVar100);
  auVar85 = vpminsd_avx2(auVar92,auVar99);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85 = vpminsd_avx2(auVar93,auVar98);
  uVar131 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar88._4_4_ = uVar131;
  auVar88._0_4_ = uVar131;
  auVar88._8_4_ = uVar131;
  auVar88._12_4_ = uVar131;
  auVar88._16_4_ = uVar131;
  auVar88._20_4_ = uVar131;
  auVar88._24_4_ = uVar131;
  auVar88._28_4_ = uVar131;
  auVar85 = vmaxps_avx512vl(auVar85,auVar88);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_220 = vmulps_avx512vl(auVar87,auVar85);
  auVar87 = vpmaxsd_avx2(auVar91,auVar100);
  auVar85 = vpmaxsd_avx2(auVar92,auVar99);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar85 = vpmaxsd_avx2(auVar93,auVar98);
  fVar147 = (ray->super_RayK<1>).tfar;
  auVar89._4_4_ = fVar147;
  auVar89._0_4_ = fVar147;
  auVar89._8_4_ = fVar147;
  auVar89._12_4_ = fVar147;
  auVar89._16_4_ = fVar147;
  auVar89._20_4_ = fVar147;
  auVar89._24_4_ = fVar147;
  auVar89._28_4_ = fVar147;
  auVar85 = vminps_avx512vl(auVar85,auVar89);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar90);
  uVar23 = vpcmpgtd_avx512vl(auVar86,_DAT_01fe9900);
  uVar21 = vcmpps_avx512vl(local_220,auVar87,2);
  if ((byte)((byte)uVar21 & (byte)uVar23) == 0) {
    return;
  }
  uVar66 = (ulong)(byte)((byte)uVar21 & (byte)uVar23);
  local_4a8 = prim;
LAB_01cd4722:
  lVar67 = 0;
  for (uVar64 = uVar66; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  local_8f0 = (ulong)*(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8e8 = (ulong)*(uint *)(prim + lVar67 * 4 + 6);
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(prim + lVar67 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar75 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * uVar64);
  auVar76 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * (uVar64 + 1));
  auVar133._8_4_ = 0xbeaaaaab;
  auVar133._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar133._12_4_ = 0xbeaaaaab;
  auVar78 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar9[2].intersectionFilterN +
                              uVar64 * (long)pGVar9[2].pointQueryFunc),auVar75,auVar133);
  auVar79 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar9[2].intersectionFilterN +
                             (long)pGVar9[2].pointQueryFunc * (uVar64 + 1)),auVar76,auVar133);
  auVar209._0_4_ = auVar76._0_4_ + auVar75._0_4_ + auVar78._0_4_ + auVar79._0_4_;
  auVar209._4_4_ = auVar76._4_4_ + auVar75._4_4_ + auVar78._4_4_ + auVar79._4_4_;
  auVar209._8_4_ = auVar76._8_4_ + auVar75._8_4_ + auVar78._8_4_ + auVar79._8_4_;
  auVar209._12_4_ = auVar76._12_4_ + auVar75._12_4_ + auVar78._12_4_ + auVar79._12_4_;
  aVar5 = (ray->super_RayK<1>).org.field_0;
  aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar81._8_4_ = 0x3e800000;
  auVar81._0_8_ = 0x3e8000003e800000;
  auVar81._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar209,auVar81);
  auVar73 = vsubps_avx(auVar73,(undefined1  [16])aVar5);
  auVar73 = vdpps_avx(auVar73,(undefined1  [16])aVar6,0x7f);
  auVar77 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar228._4_12_ = ZEXT812(0) << 0x20;
  auVar228._0_4_ = auVar77._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
  auVar77 = vfnmadd213ss_fma(auVar74,auVar77,ZEXT416(0x40000000));
  fVar147 = auVar73._0_4_ * auVar74._0_4_ * auVar77._0_4_;
  local_510 = ZEXT416((uint)fVar147);
  auVar210._4_4_ = fVar147;
  auVar210._0_4_ = fVar147;
  auVar210._8_4_ = fVar147;
  auVar210._12_4_ = fVar147;
  fStack_590 = fVar147;
  _local_5a0 = auVar210;
  fStack_58c = fVar147;
  fStack_588 = fVar147;
  fStack_584 = fVar147;
  auVar73 = vfmadd231ps_fma((undefined1  [16])aVar5,(undefined1  [16])aVar6,auVar210);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar75,auVar73);
  local_640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
  auVar247 = ZEXT3264(local_640);
  auVar77 = vsubps_avx(auVar79,auVar73);
  auVar85 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar250 = ZEXT3264(auVar85);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
  auVar249 = ZEXT3264(local_7a0);
  auVar79 = vsubps_avx(auVar78,auVar73);
  auVar76 = vsubps_avx(auVar76,auVar73);
  uVar131 = auVar75._0_4_;
  local_720._4_4_ = uVar131;
  local_720._0_4_ = uVar131;
  local_720._8_4_ = uVar131;
  local_720._12_4_ = uVar131;
  local_720._16_4_ = uVar131;
  local_720._20_4_ = uVar131;
  local_720._24_4_ = uVar131;
  local_720._28_4_ = uVar131;
  auVar229 = ZEXT3264(local_720);
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_420 = ZEXT1632(auVar75);
  local_740 = vpermps_avx2(auVar107,local_420);
  auVar231 = ZEXT3264(local_740);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  local_760 = vpermps_avx2(auVar110,local_420);
  auVar233 = ZEXT3264(local_760);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  local_780 = vpermps_avx2(auVar111,local_420);
  auVar236 = ZEXT3264(local_780);
  uVar131 = auVar79._0_4_;
  local_3e0._4_4_ = uVar131;
  local_3e0._0_4_ = uVar131;
  local_3e0._8_4_ = uVar131;
  local_3e0._12_4_ = uVar131;
  local_3e0._16_4_ = uVar131;
  local_3e0._20_4_ = uVar131;
  local_3e0._24_4_ = uVar131;
  local_3e0._28_4_ = uVar131;
  auVar222 = ZEXT3264(local_3e0);
  local_460 = ZEXT1632(auVar79);
  local_400 = vpermps_avx2(auVar107,local_460);
  local_7c0 = vpermps_avx512vl(auVar110,local_460);
  auVar253 = ZEXT3264(local_7c0);
  local_7e0 = vpermps_avx2(auVar111,local_460);
  auVar240 = ZEXT3264(local_7e0);
  local_800 = vbroadcastss_avx512vl(auVar77);
  auVar241 = ZEXT3264(local_800);
  local_440 = ZEXT1632(auVar77);
  local_680 = vpermps_avx512vl(auVar107,local_440);
  auVar242 = ZEXT3264(local_680);
  local_6a0 = vpermps_avx512vl(auVar110,local_440);
  auVar243 = ZEXT3264(local_6a0);
  local_820 = vpermps_avx512vl(auVar111,local_440);
  auVar244 = ZEXT3264(local_820);
  auVar208 = ZEXT3264(local_400);
  local_6c0 = vbroadcastss_avx512vl(auVar76);
  auVar245 = ZEXT3264(local_6c0);
  _local_480 = ZEXT1632(auVar76);
  local_840 = vpermps_avx512vl(auVar107,_local_480);
  auVar246 = ZEXT3264(local_840);
  local_6e0 = vpermps_avx512vl(auVar110,_local_480);
  auVar248 = ZEXT3264(local_6e0);
  local_860 = vpermps_avx512vl(auVar111,_local_480);
  auVar251 = ZEXT3264(local_860);
  auVar87 = vpermps_avx2(auVar110,ZEXT1632(CONCAT412(aVar6.field_3.w * aVar6.field_3.w,
                                                     CONCAT48(aVar6.z * aVar6.z,
                                                              CONCAT44(aVar6.y * aVar6.y,
                                                                       aVar6.x * aVar6.x)))));
  auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar85);
  local_1e0 = vfmadd231ps_avx512vl(auVar87,local_640,local_640);
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar105);
  local_200 = local_1e0;
  local_864 = 1;
  uVar64 = 0;
  local_2f0 = ZEXT816(0x3f80000000000000);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar252 = ZEXT3264(auVar87);
  do {
    auVar75 = vmovshdup_avx(local_2f0);
    auVar75 = vsubps_avx(auVar75,local_2f0);
    fVar147 = auVar75._0_4_;
    fVar132 = fVar147 * 0.04761905;
    local_8e0._0_4_ = local_2f0._0_4_;
    local_8e0._4_4_ = local_8e0._0_4_;
    fStack_8d8 = (float)local_8e0._0_4_;
    fStack_8d4 = (float)local_8e0._0_4_;
    register0x000012d0 = local_8e0._0_4_;
    register0x000012d4 = local_8e0._0_4_;
    register0x000012d8 = local_8e0._0_4_;
    register0x000012dc = local_8e0._0_4_;
    auVar211._4_4_ = fVar147;
    auVar211._0_4_ = fVar147;
    auVar211._8_4_ = fVar147;
    auVar211._12_4_ = fVar147;
    local_700._16_4_ = fVar147;
    local_700._0_16_ = auVar211;
    local_700._20_4_ = fVar147;
    local_700._24_4_ = fVar147;
    local_700._28_4_ = fVar147;
    auVar75 = vfmadd231ps_fma(_local_8e0,local_700,_DAT_01faff20);
    auVar106 = auVar252._0_32_;
    auVar87 = vsubps_avx512vl(auVar106,ZEXT1632(auVar75));
    fVar147 = auVar75._0_4_;
    fVar130 = auVar75._4_4_;
    auVar61._4_4_ = auVar222._4_4_ * fVar130;
    auVar61._0_4_ = auVar222._0_4_ * fVar147;
    fVar158 = auVar75._8_4_;
    auVar61._8_4_ = auVar222._8_4_ * fVar158;
    fVar160 = auVar75._12_4_;
    auVar61._12_4_ = auVar222._12_4_ * fVar160;
    auVar61._16_4_ = auVar222._16_4_ * 0.0;
    auVar61._20_4_ = auVar222._20_4_ * 0.0;
    auVar61._24_4_ = auVar222._24_4_ * 0.0;
    auVar61._28_4_ = DAT_01faff20._28_4_;
    auVar43._4_4_ = auVar208._4_4_ * fVar130;
    auVar43._0_4_ = auVar208._0_4_ * fVar147;
    auVar43._8_4_ = auVar208._8_4_ * fVar158;
    auVar43._12_4_ = auVar208._12_4_ * fVar160;
    auVar43._16_4_ = auVar208._16_4_ * 0.0;
    auVar43._20_4_ = auVar208._20_4_ * 0.0;
    auVar43._24_4_ = auVar208._24_4_ * 0.0;
    auVar43._28_4_ = local_8e0._0_4_;
    auVar85 = vmulps_avx512vl(auVar253._0_32_,ZEXT1632(auVar75));
    auVar223._0_4_ = auVar240._0_4_ * fVar147;
    auVar223._4_4_ = auVar240._4_4_ * fVar130;
    auVar223._8_4_ = auVar240._8_4_ * fVar158;
    auVar223._12_4_ = auVar240._12_4_ * fVar160;
    auVar223._16_4_ = auVar240._16_4_ * 0.0;
    auVar223._20_4_ = auVar240._20_4_ * 0.0;
    auVar223._28_36_ = auVar222._28_36_;
    auVar223._24_4_ = auVar240._24_4_ * 0.0;
    auVar76 = vfmadd231ps_fma(auVar61,auVar87,auVar229._0_32_);
    auVar73 = vfmadd231ps_fma(auVar43,auVar87,auVar231._0_32_);
    auVar77 = vfmadd231ps_fma(auVar85,auVar87,auVar233._0_32_);
    auVar79 = vfmadd231ps_fma(auVar223._0_32_,auVar87,auVar236._0_32_);
    auVar85 = vmulps_avx512vl(auVar241._0_32_,ZEXT1632(auVar75));
    auVar91 = ZEXT1632(auVar75);
    auVar88 = vmulps_avx512vl(auVar242._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar243._0_32_,auVar91);
    auVar90 = vmulps_avx512vl(auVar244._0_32_,auVar91);
    auVar78 = vfmadd231ps_fma(auVar85,auVar87,auVar222._0_32_);
    auVar74 = vfmadd231ps_fma(auVar88,auVar87,auVar208._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar253._0_32_);
    auVar80 = vfmadd231ps_fma(auVar90,auVar87,auVar240._0_32_);
    auVar88 = vmulps_avx512vl(auVar245._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar246._0_32_,auVar91);
    auVar90 = vmulps_avx512vl(auVar248._0_32_,auVar91);
    auVar86 = vmulps_avx512vl(auVar251._0_32_,auVar91);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar241._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar242._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar243._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar87,auVar244._0_32_);
    auVar208._28_36_ = auVar240._28_36_;
    auVar208._0_28_ =
         ZEXT1628(CONCAT412(fVar160 * auVar78._12_4_,
                            CONCAT48(fVar158 * auVar78._8_4_,
                                     CONCAT44(fVar130 * auVar78._4_4_,fVar147 * auVar78._0_4_))));
    auVar91 = vmulps_avx512vl(auVar91,ZEXT1632(auVar74));
    auVar92 = vmulps_avx512vl(ZEXT1632(auVar75),auVar85);
    auVar93 = vmulps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar80));
    auVar75 = vfmadd231ps_fma(auVar208._0_32_,auVar87,ZEXT1632(auVar76));
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,ZEXT1632(auVar73));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar77));
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar79));
    auVar220._0_4_ = auVar88._0_4_ * fVar147;
    auVar220._4_4_ = auVar88._4_4_ * fVar130;
    auVar220._8_4_ = auVar88._8_4_ * fVar158;
    auVar220._12_4_ = auVar88._12_4_ * fVar160;
    auVar220._16_4_ = auVar88._16_4_ * 0.0;
    auVar220._20_4_ = auVar88._20_4_ * 0.0;
    auVar220._24_4_ = auVar88._24_4_ * 0.0;
    auVar220._28_4_ = 0;
    auVar44._4_4_ = auVar89._4_4_ * fVar130;
    auVar44._0_4_ = auVar89._0_4_ * fVar147;
    auVar44._8_4_ = auVar89._8_4_ * fVar158;
    auVar44._12_4_ = auVar89._12_4_ * fVar160;
    auVar44._16_4_ = auVar89._16_4_ * 0.0;
    auVar44._20_4_ = auVar89._20_4_ * 0.0;
    auVar44._24_4_ = auVar89._24_4_ * 0.0;
    auVar44._28_4_ = auVar88._28_4_;
    auVar45._4_4_ = auVar90._4_4_ * fVar130;
    auVar45._0_4_ = auVar90._0_4_ * fVar147;
    auVar45._8_4_ = auVar90._8_4_ * fVar158;
    auVar45._12_4_ = auVar90._12_4_ * fVar160;
    auVar45._16_4_ = auVar90._16_4_ * 0.0;
    auVar45._20_4_ = auVar90._20_4_ * 0.0;
    auVar45._24_4_ = auVar90._24_4_ * 0.0;
    auVar45._28_4_ = auVar89._28_4_;
    auVar46._4_4_ = auVar86._4_4_ * fVar130;
    auVar46._0_4_ = auVar86._0_4_ * fVar147;
    auVar46._8_4_ = auVar86._8_4_ * fVar158;
    auVar46._12_4_ = auVar86._12_4_ * fVar160;
    auVar46._16_4_ = auVar86._16_4_ * 0.0;
    auVar46._20_4_ = auVar86._20_4_ * 0.0;
    auVar46._24_4_ = auVar86._24_4_ * 0.0;
    auVar46._28_4_ = auVar90._28_4_;
    auVar76 = vfmadd231ps_fma(auVar220,auVar87,ZEXT1632(auVar78));
    auVar73 = vfmadd231ps_fma(auVar44,auVar87,ZEXT1632(auVar74));
    auVar77 = vfmadd231ps_fma(auVar45,auVar87,auVar85);
    auVar79 = vfmadd231ps_fma(auVar46,auVar87,ZEXT1632(auVar80));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar76._12_4_,
                                                 CONCAT48(fVar158 * auVar76._8_4_,
                                                          CONCAT44(fVar130 * auVar76._4_4_,
                                                                   fVar147 * auVar76._0_4_)))),
                              auVar87,ZEXT1632(auVar75));
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar73._12_4_ * fVar160,
                                            CONCAT48(auVar73._8_4_ * fVar158,
                                                     CONCAT44(auVar73._4_4_ * fVar130,
                                                              auVar73._0_4_ * fVar147)))),auVar87,
                         auVar91);
    auVar84 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar160,
                                            CONCAT48(auVar77._8_4_ * fVar158,
                                                     CONCAT44(auVar77._4_4_ * fVar130,
                                                              auVar77._0_4_ * fVar147)))),auVar87,
                         auVar92);
    auVar88 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar160,
                                            CONCAT48(auVar79._8_4_ * fVar158,
                                                     CONCAT44(auVar79._4_4_ * fVar130,
                                                              auVar79._0_4_ * fVar147)))),auVar93,
                         auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar75));
    auVar85 = vsubps_avx512vl(ZEXT1632(auVar73),auVar91);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar77),auVar92);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar79),auVar93);
    auVar234._0_4_ = fVar132 * auVar87._0_4_ * 3.0;
    auVar234._4_4_ = fVar132 * auVar87._4_4_ * 3.0;
    auVar234._8_4_ = fVar132 * auVar87._8_4_ * 3.0;
    auVar234._12_4_ = fVar132 * auVar87._12_4_ * 3.0;
    auVar234._16_4_ = fVar132 * auVar87._16_4_ * 3.0;
    auVar234._20_4_ = fVar132 * auVar87._20_4_ * 3.0;
    auVar234._24_4_ = fVar132 * auVar87._24_4_ * 3.0;
    auVar234._28_4_ = 0;
    auVar237._0_4_ = fVar132 * auVar85._0_4_ * 3.0;
    auVar237._4_4_ = fVar132 * auVar85._4_4_ * 3.0;
    auVar237._8_4_ = fVar132 * auVar85._8_4_ * 3.0;
    auVar237._12_4_ = fVar132 * auVar85._12_4_ * 3.0;
    auVar237._16_4_ = fVar132 * auVar85._16_4_ * 3.0;
    auVar237._20_4_ = fVar132 * auVar85._20_4_ * 3.0;
    auVar237._24_4_ = fVar132 * auVar85._24_4_ * 3.0;
    auVar237._28_4_ = 0;
    auVar238._0_4_ = fVar132 * auVar89._0_4_ * 3.0;
    auVar238._4_4_ = fVar132 * auVar89._4_4_ * 3.0;
    auVar238._8_4_ = fVar132 * auVar89._8_4_ * 3.0;
    auVar238._12_4_ = fVar132 * auVar89._12_4_ * 3.0;
    auVar238._16_4_ = fVar132 * auVar89._16_4_ * 3.0;
    auVar238._20_4_ = fVar132 * auVar89._20_4_ * 3.0;
    auVar238._24_4_ = fVar132 * auVar89._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    fVar147 = auVar90._0_4_ * 3.0 * fVar132;
    fVar130 = auVar90._4_4_ * 3.0 * fVar132;
    auVar47._4_4_ = fVar130;
    auVar47._0_4_ = fVar147;
    fVar158 = auVar90._8_4_ * 3.0 * fVar132;
    auVar47._8_4_ = fVar158;
    fVar160 = auVar90._12_4_ * 3.0 * fVar132;
    auVar47._12_4_ = fVar160;
    fVar162 = auVar90._16_4_ * 3.0 * fVar132;
    auVar47._16_4_ = fVar162;
    fVar164 = auVar90._20_4_ * 3.0 * fVar132;
    auVar47._20_4_ = fVar164;
    fVar166 = auVar90._24_4_ * 3.0 * fVar132;
    auVar47._24_4_ = fVar166;
    auVar47._28_4_ = fVar132;
    auVar75 = vxorps_avx512vl(auVar253._0_16_,auVar253._0_16_);
    auVar91 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01feed00,ZEXT1632(auVar75));
    auVar92 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,ZEXT1632(auVar75));
    auVar89 = ZEXT1632(auVar75);
    auVar93 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar89);
    auVar216._0_4_ = auVar88._0_4_ + fVar147;
    auVar216._4_4_ = auVar88._4_4_ + fVar130;
    auVar216._8_4_ = auVar88._8_4_ + fVar158;
    auVar216._12_4_ = auVar88._12_4_ + fVar160;
    auVar216._16_4_ = auVar88._16_4_ + fVar162;
    auVar216._20_4_ = auVar88._20_4_ + fVar164;
    auVar216._24_4_ = auVar88._24_4_ + fVar166;
    auVar216._28_4_ = auVar88._28_4_ + fVar132;
    auVar87 = vmaxps_avx(auVar88,auVar216);
    auVar85 = vminps_avx(auVar88,auVar216);
    auVar95 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar89);
    auVar96 = vpermt2ps_avx512vl(auVar234,_DAT_01feed00,auVar89);
    auVar82 = vpermt2ps_avx512vl(auVar237,_DAT_01feed00,auVar89);
    auVar105 = ZEXT1632(auVar75);
    auVar83 = vpermt2ps_avx512vl(auVar238,_DAT_01feed00,auVar105);
    auVar88 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar105);
    auVar88 = vsubps_avx(auVar95,auVar88);
    auVar89 = vsubps_avx(auVar91,ZEXT1632(auVar78));
    auVar90 = vsubps_avx(auVar92,auVar94);
    auVar86 = vsubps_avx(auVar93,auVar84);
    auVar97 = vmulps_avx512vl(auVar90,auVar238);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar237,auVar86);
    auVar98 = vmulps_avx512vl(auVar86,auVar234);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar238,auVar89);
    auVar99 = vmulps_avx512vl(auVar89,auVar237);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar234,auVar90);
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar97);
    auVar98 = vmulps_avx512vl(auVar86,auVar86);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar90);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar89);
    auVar99 = vrcp14ps_avx512vl(auVar98);
    auVar100 = vfnmadd213ps_avx512vl(auVar99,auVar98,auVar106);
    auVar99 = vfmadd132ps_avx512vl(auVar100,auVar99,auVar99);
    auVar97 = vmulps_avx512vl(auVar97,auVar99);
    auVar100 = vmulps_avx512vl(auVar90,auVar83);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar82,auVar86);
    auVar101 = vmulps_avx512vl(auVar86,auVar96);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar83,auVar89);
    auVar102 = vmulps_avx512vl(auVar89,auVar82);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar96,auVar90);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar99 = vmulps_avx512vl(auVar100,auVar99);
    auVar97 = vmaxps_avx512vl(auVar97,auVar99);
    auVar97 = vsqrtps_avx512vl(auVar97);
    auVar99 = vmaxps_avx512vl(auVar88,auVar95);
    auVar87 = vmaxps_avx512vl(auVar87,auVar99);
    auVar99 = vaddps_avx512vl(auVar97,auVar87);
    auVar87 = vminps_avx(auVar88,auVar95);
    auVar87 = vminps_avx(auVar85,auVar87);
    auVar87 = vsubps_avx512vl(auVar87,auVar97);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar85 = vmulps_avx512vl(auVar99,auVar112);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    local_540 = vmulps_avx512vl(auVar87,auVar113);
    auVar87 = vmulps_avx512vl(auVar85,auVar85);
    auVar85 = vrsqrt14ps_avx512vl(auVar98);
    auVar35._8_4_ = 0xbf000000;
    auVar35._0_8_ = 0xbf000000bf000000;
    auVar35._12_4_ = 0xbf000000;
    auVar35._16_4_ = 0xbf000000;
    auVar35._20_4_ = 0xbf000000;
    auVar35._24_4_ = 0xbf000000;
    auVar35._28_4_ = 0xbf000000;
    auVar88 = vmulps_avx512vl(auVar98,auVar35);
    fVar147 = auVar85._0_4_;
    fVar130 = auVar85._4_4_;
    fVar158 = auVar85._8_4_;
    fVar160 = auVar85._12_4_;
    fVar132 = auVar85._16_4_;
    fVar162 = auVar85._20_4_;
    fVar164 = auVar85._24_4_;
    auVar48._4_4_ = fVar130 * fVar130 * fVar130 * auVar88._4_4_;
    auVar48._0_4_ = fVar147 * fVar147 * fVar147 * auVar88._0_4_;
    auVar48._8_4_ = fVar158 * fVar158 * fVar158 * auVar88._8_4_;
    auVar48._12_4_ = fVar160 * fVar160 * fVar160 * auVar88._12_4_;
    auVar48._16_4_ = fVar132 * fVar132 * fVar132 * auVar88._16_4_;
    auVar48._20_4_ = fVar162 * fVar162 * fVar162 * auVar88._20_4_;
    auVar48._24_4_ = fVar164 * fVar164 * fVar164 * auVar88._24_4_;
    auVar48._28_4_ = auVar99._28_4_;
    auVar36._8_4_ = 0x3fc00000;
    auVar36._0_8_ = 0x3fc000003fc00000;
    auVar36._12_4_ = 0x3fc00000;
    auVar36._16_4_ = 0x3fc00000;
    auVar36._20_4_ = 0x3fc00000;
    auVar36._24_4_ = 0x3fc00000;
    auVar36._28_4_ = 0x3fc00000;
    auVar85 = vfmadd231ps_avx512vl(auVar48,auVar85,auVar36);
    auVar88 = vmulps_avx512vl(auVar89,auVar85);
    auVar95 = vmulps_avx512vl(auVar90,auVar85);
    auVar97 = vmulps_avx512vl(auVar86,auVar85);
    auVar207 = ZEXT1632(auVar78);
    auVar98 = vsubps_avx512vl(auVar105,auVar207);
    auVar99 = vsubps_avx512vl(auVar105,auVar94);
    auVar100 = vsubps_avx512vl(auVar105,auVar84);
    auVar101 = vmulps_avx512vl(auVar249._0_32_,auVar100);
    local_5e0 = auVar250._0_32_;
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_5e0,auVar99);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar247._0_32_,auVar98);
    auVar102 = vmulps_avx512vl(auVar100,auVar100);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar99);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
    auVar103 = vmulps_avx512vl(auVar249._0_32_,auVar97);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_5e0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar247._0_32_);
    auVar97 = vmulps_avx512vl(auVar100,auVar97);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar95);
    auVar88 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar88);
    auVar95 = vmulps_avx512vl(auVar103,auVar103);
    auVar97 = vsubps_avx512vl(local_1e0,auVar95);
    auVar104 = vmulps_avx512vl(auVar103,auVar88);
    auVar101 = vsubps_avx512vl(auVar101,auVar104);
    auVar101 = vaddps_avx512vl(auVar101,auVar101);
    auVar104 = vmulps_avx512vl(auVar88,auVar88);
    local_660 = vsubps_avx512vl(auVar102,auVar104);
    auVar87 = vsubps_avx512vl(local_660,auVar87);
    local_560 = vmulps_avx512vl(auVar101,auVar101);
    auVar37._8_4_ = 0x40800000;
    auVar37._0_8_ = 0x4080000040800000;
    auVar37._12_4_ = 0x40800000;
    auVar37._16_4_ = 0x40800000;
    auVar37._20_4_ = 0x40800000;
    auVar37._24_4_ = 0x40800000;
    auVar37._28_4_ = 0x40800000;
    _local_360 = vmulps_avx512vl(auVar97,auVar37);
    auVar102 = vmulps_avx512vl(_local_360,auVar87);
    auVar102 = vsubps_avx512vl(local_560,auVar102);
    uVar70 = vcmpps_avx512vl(auVar102,auVar105,5);
    bVar62 = (byte)uVar70;
    fVar147 = (float)local_5a0._0_4_;
    fVar130 = (float)local_5a0._4_4_;
    fVar158 = fStack_598;
    fVar160 = fStack_594;
    fVar132 = fStack_590;
    fVar162 = fStack_58c;
    fVar164 = fStack_588;
    fVar166 = fStack_584;
    if (bVar62 == 0) {
LAB_01cd52f4:
      auVar247 = ZEXT3264(local_640);
      auVar249 = ZEXT3264(local_7a0);
      auVar229 = ZEXT3264(local_720);
      auVar231 = ZEXT3264(local_740);
      auVar233 = ZEXT3264(local_760);
      auVar236 = ZEXT3264(local_780);
      auVar222 = ZEXT3264(local_3e0);
      auVar208 = ZEXT3264(local_400);
      auVar253 = ZEXT3264(local_7c0);
      auVar240 = ZEXT3264(local_7e0);
      auVar241 = ZEXT3264(local_800);
      auVar242 = ZEXT3264(local_680);
      auVar243 = ZEXT3264(local_6a0);
      auVar244 = ZEXT3264(local_820);
      auVar245 = ZEXT3264(local_6c0);
      auVar246 = ZEXT3264(local_840);
      auVar248 = ZEXT3264(local_6e0);
      auVar251 = ZEXT3264(local_860);
    }
    else {
      auVar104 = _local_360;
      auVar102 = vsqrtps_avx512vl(auVar102);
      auVar105 = vaddps_avx512vl(auVar97,auVar97);
      local_5c0 = vrcp14ps_avx512vl(auVar105);
      auVar106 = vfnmadd213ps_avx512vl(local_5c0,auVar105,auVar106);
      auVar106 = vfmadd132ps_avx512vl(auVar106,local_5c0,local_5c0);
      auVar38._8_4_ = 0x80000000;
      auVar38._0_8_ = 0x8000000080000000;
      auVar38._12_4_ = 0x80000000;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      local_580 = vxorps_avx512vl(auVar101,auVar38);
      auVar107 = vsubps_avx512vl(local_580,auVar102);
      auVar107 = vmulps_avx512vl(auVar107,auVar106);
      auVar102 = vsubps_avx512vl(auVar102,auVar101);
      local_380 = vmulps_avx512vl(auVar102,auVar106);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = vblendmps_avx512vl(auVar102,auVar107);
      auVar108._0_4_ =
           (uint)(bVar62 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar106._0_4_;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar106._4_4_;
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar106._8_4_;
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar106._12_4_;
      bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar108._16_4_ = (uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar106._16_4_;
      bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar108._20_4_ = (uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar106._20_4_;
      bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar108._24_4_ = (uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar106._24_4_;
      bVar13 = SUB81(uVar70 >> 7,0);
      auVar108._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar106._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar106 = vblendmps_avx512vl(auVar102,local_380);
      auVar109._0_4_ =
           (uint)(bVar62 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar102._0_4_;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar102._4_4_;
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar102._8_4_;
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar102._12_4_;
      bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar109._16_4_ = (uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * auVar102._16_4_;
      bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar109._20_4_ = (uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * auVar102._20_4_;
      bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar109._24_4_ = (uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * auVar102._24_4_;
      bVar13 = SUB81(uVar70 >> 7,0);
      auVar109._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar95,auVar102);
      local_3a0 = vmaxps_avx512vl(local_200,auVar102);
      auVar39._8_4_ = 0x36000000;
      auVar39._0_8_ = 0x3600000036000000;
      auVar39._12_4_ = 0x36000000;
      auVar39._16_4_ = 0x36000000;
      auVar39._20_4_ = 0x36000000;
      auVar39._24_4_ = 0x36000000;
      auVar39._28_4_ = 0x36000000;
      local_3c0 = vmulps_avx512vl(local_3a0,auVar39);
      vandps_avx512vl(auVar97,auVar102);
      uVar71 = vcmpps_avx512vl(local_3c0,local_3c0,1);
      uVar70 = uVar70 & uVar71;
      bVar65 = (byte)uVar70;
      if (bVar65 != 0) {
        uVar71 = vcmpps_avx512vl(auVar87,_DAT_01faff00,2);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar97 = vblendmps_avx512vl(auVar87,auVar95);
        bVar12 = (byte)uVar71;
        uVar72 = (uint)(bVar12 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar12 & 1) * local_3c0._0_4_;
        bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar123 = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * local_3c0._4_4_;
        bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar124 = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * local_3c0._8_4_;
        bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar125 = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * local_3c0._12_4_;
        bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar126 = (uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * local_3c0._16_4_;
        bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar127 = (uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * local_3c0._20_4_;
        bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar128 = (uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * local_3c0._24_4_;
        bVar13 = SUB81(uVar71 >> 7,0);
        uVar129 = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * local_3c0._28_4_;
        auVar108._0_4_ = (bVar65 & 1) * uVar72 | !(bool)(bVar65 & 1) * auVar108._0_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar108._4_4_ = bVar13 * uVar123 | !bVar13 * auVar108._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar108._8_4_ = bVar13 * uVar124 | !bVar13 * auVar108._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar108._12_4_ = bVar13 * uVar125 | !bVar13 * auVar108._12_4_;
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar108._16_4_ = bVar13 * uVar126 | !bVar13 * auVar108._16_4_;
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar108._20_4_ = bVar13 * uVar127 | !bVar13 * auVar108._20_4_;
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar108._24_4_ = bVar13 * uVar128 | !bVar13 * auVar108._24_4_;
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar108._28_4_ = bVar13 * uVar129 | !bVar13 * auVar108._28_4_;
        auVar87 = vblendmps_avx512vl(auVar95,auVar87);
        bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar20 = SUB81(uVar71 >> 7,0);
        auVar109._0_4_ =
             (uint)(bVar65 & 1) *
             ((uint)(bVar12 & 1) * auVar87._0_4_ | !(bool)(bVar12 & 1) * uVar72) |
             !(bool)(bVar65 & 1) * auVar109._0_4_;
        bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar109._4_4_ =
             (uint)bVar14 * ((uint)bVar13 * auVar87._4_4_ | !bVar13 * uVar123) |
             !bVar14 * auVar109._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar109._8_4_ =
             (uint)bVar13 * ((uint)bVar15 * auVar87._8_4_ | !bVar15 * uVar124) |
             !bVar13 * auVar109._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar109._12_4_ =
             (uint)bVar13 * ((uint)bVar16 * auVar87._12_4_ | !bVar16 * uVar125) |
             !bVar13 * auVar109._12_4_;
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar109._16_4_ =
             (uint)bVar13 * ((uint)bVar17 * auVar87._16_4_ | !bVar17 * uVar126) |
             !bVar13 * auVar109._16_4_;
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar109._20_4_ =
             (uint)bVar13 * ((uint)bVar18 * auVar87._20_4_ | !bVar18 * uVar127) |
             !bVar13 * auVar109._20_4_;
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar109._24_4_ =
             (uint)bVar13 * ((uint)bVar19 * auVar87._24_4_ | !bVar19 * uVar128) |
             !bVar13 * auVar109._24_4_;
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar109._28_4_ =
             (uint)bVar13 * ((uint)bVar20 * auVar87._28_4_ | !bVar20 * uVar129) |
             !bVar13 * auVar109._28_4_;
        bVar62 = (~bVar65 | bVar12) & bVar62;
      }
      if ((bVar62 & 0x7f) == 0) {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar252 = ZEXT3264(auVar87);
        goto LAB_01cd52f4;
      }
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar83 = vxorps_avx512vl(auVar83,auVar95);
      auVar96 = vxorps_avx512vl(auVar96,auVar95);
      auVar82 = vxorps_avx512vl(auVar82,auVar95);
      auVar75 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_510);
      auVar87 = vbroadcastss_avx512vl(auVar75);
      auVar87 = vmaxps_avx512vl(auVar87,auVar108);
      auVar75 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_510);
      auVar97 = vbroadcastss_avx512vl(auVar75);
      auVar97 = vminps_avx512vl(auVar97,auVar109);
      auVar100 = vmulps_avx512vl(auVar100,auVar238);
      auVar99 = vfmadd213ps_avx512vl(auVar99,auVar237,auVar100);
      auVar75 = vfmadd213ps_fma(auVar98,auVar234,auVar99);
      auVar98 = vmulps_avx512vl(local_7a0,auVar238);
      auVar76 = vfmadd231ps_fma(auVar98,auVar237,local_5e0);
      auVar247 = ZEXT3264(local_640);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),local_640,auVar234);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar98,auVar99);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar99,auVar100,1);
      auVar102 = vxorps_avx512vl(ZEXT1632(auVar75),auVar95);
      auVar106 = vrcp14ps_avx512vl(auVar98);
      auVar110 = vxorps_avx512vl(auVar98,auVar95);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar112 = vfnmadd213ps_avx512vl(auVar106,auVar98,auVar111);
      auVar75 = vfmadd132ps_fma(auVar112,auVar106,auVar106);
      fVar190 = auVar75._0_4_ * auVar102._0_4_;
      fVar157 = auVar75._4_4_ * auVar102._4_4_;
      auVar49._4_4_ = fVar157;
      auVar49._0_4_ = fVar190;
      fVar159 = auVar75._8_4_ * auVar102._8_4_;
      auVar49._8_4_ = fVar159;
      fVar161 = auVar75._12_4_ * auVar102._12_4_;
      auVar49._12_4_ = fVar161;
      fVar163 = auVar102._16_4_ * 0.0;
      auVar49._16_4_ = fVar163;
      fVar165 = auVar102._20_4_ * 0.0;
      auVar49._20_4_ = fVar165;
      fVar167 = auVar102._24_4_ * 0.0;
      auVar49._24_4_ = fVar167;
      auVar49._28_4_ = auVar102._28_4_;
      uVar23 = vcmpps_avx512vl(auVar98,auVar110,1);
      bVar65 = (byte)uVar21 | (byte)uVar23;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar49,auVar112);
      auVar114._0_4_ =
           (uint)(bVar65 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar106._0_4_;
      bVar13 = (bool)(bVar65 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar106._4_4_;
      bVar13 = (bool)(bVar65 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar106._8_4_;
      bVar13 = (bool)(bVar65 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar106._12_4_;
      bVar13 = (bool)(bVar65 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar106._16_4_;
      bVar13 = (bool)(bVar65 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar106._20_4_;
      bVar13 = (bool)(bVar65 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar106._24_4_;
      auVar114._28_4_ =
           (uint)(bVar65 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar106._28_4_;
      auVar106 = vmaxps_avx512vl(auVar87,auVar114);
      uVar23 = vcmpps_avx512vl(auVar98,auVar110,6);
      bVar65 = (byte)uVar21 | (byte)uVar23;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115._0_4_ = (uint)(bVar65 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)fVar190
      ;
      bVar13 = (bool)(bVar65 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * (int)fVar157;
      bVar13 = (bool)(bVar65 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * (int)fVar159;
      bVar13 = (bool)(bVar65 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * (int)fVar161;
      bVar13 = (bool)(bVar65 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * (int)fVar163;
      bVar13 = (bool)(bVar65 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * (int)fVar165;
      bVar13 = (bool)(bVar65 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * (int)fVar167;
      auVar115._28_4_ =
           (uint)(bVar65 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar102._28_4_;
      auVar97 = vminps_avx512vl(auVar97,auVar115);
      auVar87 = vsubps_avx(ZEXT832(0) << 0x20,auVar91);
      auVar91 = vsubps_avx(ZEXT832(0) << 0x20,auVar92);
      auVar102 = ZEXT832(0) << 0x20;
      auVar92 = vsubps_avx(auVar102,auVar93);
      auVar92 = vmulps_avx512vl(auVar92,auVar83);
      auVar91 = vfmadd231ps_avx512vl(auVar92,auVar82,auVar91);
      auVar87 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar87);
      auVar91 = vmulps_avx512vl(local_7a0,auVar83);
      auVar250 = ZEXT3264(local_5e0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_5e0,auVar82);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_640,auVar96);
      vandps_avx512vl(auVar91,auVar99);
      uVar21 = vcmpps_avx512vl(auVar91,auVar100,1);
      auVar87 = vxorps_avx512vl(auVar87,auVar95);
      auVar92 = vrcp14ps_avx512vl(auVar91);
      auVar93 = vxorps_avx512vl(auVar91,auVar95);
      auVar95 = vfnmadd213ps_avx512vl(auVar92,auVar91,auVar111);
      auVar75 = vfmadd132ps_fma(auVar95,auVar92,auVar92);
      fVar190 = auVar75._0_4_ * auVar87._0_4_;
      fVar157 = auVar75._4_4_ * auVar87._4_4_;
      auVar50._4_4_ = fVar157;
      auVar50._0_4_ = fVar190;
      fVar159 = auVar75._8_4_ * auVar87._8_4_;
      auVar50._8_4_ = fVar159;
      fVar161 = auVar75._12_4_ * auVar87._12_4_;
      auVar50._12_4_ = fVar161;
      fVar163 = auVar87._16_4_ * 0.0;
      auVar50._16_4_ = fVar163;
      fVar165 = auVar87._20_4_ * 0.0;
      auVar50._20_4_ = fVar165;
      fVar167 = auVar87._24_4_ * 0.0;
      auVar50._24_4_ = fVar167;
      auVar50._28_4_ = auVar87._28_4_;
      uVar23 = vcmpps_avx512vl(auVar91,auVar93,1);
      bVar65 = (byte)uVar21 | (byte)uVar23;
      auVar95 = vblendmps_avx512vl(auVar50,auVar112);
      auVar116._0_4_ =
           (uint)(bVar65 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar92._0_4_;
      bVar13 = (bool)(bVar65 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar92._4_4_;
      bVar13 = (bool)(bVar65 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar92._8_4_;
      bVar13 = (bool)(bVar65 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar92._12_4_;
      bVar13 = (bool)(bVar65 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar13 * auVar95._16_4_ | (uint)!bVar13 * auVar92._16_4_;
      bVar13 = (bool)(bVar65 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar13 * auVar95._20_4_ | (uint)!bVar13 * auVar92._20_4_;
      bVar13 = (bool)(bVar65 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar13 * auVar95._24_4_ | (uint)!bVar13 * auVar92._24_4_;
      auVar116._28_4_ =
           (uint)(bVar65 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar92._28_4_;
      _local_4a0 = vmaxps_avx(auVar106,auVar116);
      uVar23 = vcmpps_avx512vl(auVar91,auVar93,6);
      bVar65 = (byte)uVar21 | (byte)uVar23;
      auVar117._0_4_ = (uint)(bVar65 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)fVar190
      ;
      bVar13 = (bool)(bVar65 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * (int)fVar157;
      bVar13 = (bool)(bVar65 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * (int)fVar159;
      bVar13 = (bool)(bVar65 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * (int)fVar161;
      bVar13 = (bool)(bVar65 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * (int)fVar163;
      bVar13 = (bool)(bVar65 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * (int)fVar165;
      bVar13 = (bool)(bVar65 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * (int)fVar167;
      auVar117._28_4_ =
           (uint)(bVar65 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar87._28_4_;
      local_260 = vminps_avx(auVar97,auVar117);
      auVar87 = _local_4a0;
      uVar21 = vcmpps_avx512vl(_local_4a0,local_260,2);
      bVar62 = bVar62 & 0x7f & (byte)uVar21;
      if (bVar62 == 0) {
        auVar252 = ZEXT3264(auVar111);
        goto LAB_01cd52f4;
      }
      auVar91 = vmaxps_avx(auVar102,local_540);
      auVar92 = vfmadd213ps_avx512vl(auVar107,auVar103,auVar88);
      auVar92 = vmulps_avx512vl(auVar85,auVar92);
      auVar93 = vfmadd213ps_avx512vl(local_380,auVar103,auVar88);
      fVar190 = auVar85._0_4_;
      fVar157 = auVar85._4_4_;
      auVar51._4_4_ = fVar157 * auVar93._4_4_;
      auVar51._0_4_ = fVar190 * auVar93._0_4_;
      fVar159 = auVar85._8_4_;
      auVar51._8_4_ = fVar159 * auVar93._8_4_;
      fVar161 = auVar85._12_4_;
      auVar51._12_4_ = fVar161 * auVar93._12_4_;
      fVar163 = auVar85._16_4_;
      auVar51._16_4_ = fVar163 * auVar93._16_4_;
      fVar165 = auVar85._20_4_;
      auVar51._20_4_ = fVar165 * auVar93._20_4_;
      fVar167 = auVar85._24_4_;
      auVar51._24_4_ = fVar167 * auVar93._24_4_;
      auVar51._28_4_ = auVar93._28_4_;
      auVar92 = vminps_avx512vl(auVar92,auVar111);
      auVar93 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar95 = vminps_avx512vl(auVar51,auVar111);
      auVar52._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar92._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar52,local_700,_local_8e0);
      auVar92 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
      auVar53._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar92._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar53,local_700,_local_8e0);
      auVar54._4_4_ = auVar91._4_4_ * auVar91._4_4_;
      auVar54._0_4_ = auVar91._0_4_ * auVar91._0_4_;
      auVar54._8_4_ = auVar91._8_4_ * auVar91._8_4_;
      auVar54._12_4_ = auVar91._12_4_ * auVar91._12_4_;
      auVar54._16_4_ = auVar91._16_4_ * auVar91._16_4_;
      auVar54._20_4_ = auVar91._20_4_ * auVar91._20_4_;
      auVar54._24_4_ = auVar91._24_4_ * auVar91._24_4_;
      auVar54._28_4_ = auVar91._28_4_;
      auVar92 = vsubps_avx(local_660,auVar54);
      auVar55._4_4_ = auVar92._4_4_ * (float)local_360._4_4_;
      auVar55._0_4_ = auVar92._0_4_ * (float)local_360._0_4_;
      auVar55._8_4_ = auVar92._8_4_ * fStack_358;
      auVar55._12_4_ = auVar92._12_4_ * fStack_354;
      auVar55._16_4_ = auVar92._16_4_ * fStack_350;
      auVar55._20_4_ = auVar92._20_4_ * fStack_34c;
      auVar55._24_4_ = auVar92._24_4_ * fStack_348;
      auVar55._28_4_ = auVar91._28_4_;
      auVar91 = vsubps_avx(local_560,auVar55);
      uVar70 = vcmpps_avx512vl(auVar91,ZEXT832(0) << 0x20,5);
      auVar245 = ZEXT3264(local_6c0);
      auVar248 = ZEXT3264(local_6e0);
      if ((byte)uVar70 == 0) {
        uVar70 = 0;
        auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar208 = ZEXT864(0) << 0x20;
        auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar230 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar118._8_4_ = 0x7f800000;
        auVar118._0_8_ = 0x7f8000007f800000;
        auVar118._12_4_ = 0x7f800000;
        auVar118._16_4_ = 0x7f800000;
        auVar118._20_4_ = 0x7f800000;
        auVar118._24_4_ = 0x7f800000;
        auVar118._28_4_ = 0x7f800000;
        auVar119._8_4_ = 0xff800000;
        auVar119._0_8_ = 0xff800000ff800000;
        auVar119._12_4_ = 0xff800000;
        auVar119._16_4_ = 0xff800000;
        auVar119._20_4_ = 0xff800000;
        auVar119._24_4_ = 0xff800000;
        auVar119._28_4_ = 0xff800000;
      }
      else {
        auVar76 = vxorps_avx512vl(auVar211,auVar211);
        uVar71 = vcmpps_avx512vl(auVar91,auVar102,5);
        auVar91 = vsqrtps_avx(auVar91);
        auVar93 = vfnmadd213ps_avx512vl(auVar105,local_5c0,auVar111);
        auVar96 = vfmadd132ps_avx512vl(auVar93,local_5c0,local_5c0);
        auVar93 = vsubps_avx(local_580,auVar91);
        auVar82 = vmulps_avx512vl(auVar93,auVar96);
        auVar91 = vsubps_avx512vl(auVar91,auVar101);
        auVar96 = vmulps_avx512vl(auVar91,auVar96);
        auVar91 = vfmadd213ps_avx512vl(auVar103,auVar82,auVar88);
        auVar56._4_4_ = fVar157 * auVar91._4_4_;
        auVar56._0_4_ = fVar190 * auVar91._0_4_;
        auVar56._8_4_ = fVar159 * auVar91._8_4_;
        auVar56._12_4_ = fVar161 * auVar91._12_4_;
        auVar56._16_4_ = fVar163 * auVar91._16_4_;
        auVar56._20_4_ = fVar165 * auVar91._20_4_;
        auVar56._24_4_ = fVar167 * auVar91._24_4_;
        auVar56._28_4_ = auVar95._28_4_;
        auVar91 = vmulps_avx512vl(local_640,auVar82);
        auVar93 = vmulps_avx512vl(local_5e0,auVar82);
        auVar83 = vmulps_avx512vl(local_7a0,auVar82);
        auVar95 = vfmadd213ps_avx512vl(auVar89,auVar56,auVar207);
        auVar91 = vsubps_avx512vl(auVar91,auVar95);
        auVar95 = vfmadd213ps_avx512vl(auVar90,auVar56,auVar94);
        auVar95 = vsubps_avx512vl(auVar93,auVar95);
        auVar75 = vfmadd213ps_fma(auVar56,auVar86,auVar84);
        auVar93 = vsubps_avx(auVar83,ZEXT1632(auVar75));
        auVar230 = auVar93._0_28_;
        auVar88 = vfmadd213ps_avx512vl(auVar103,auVar96,auVar88);
        auVar57._4_4_ = fVar157 * auVar88._4_4_;
        auVar57._0_4_ = fVar190 * auVar88._0_4_;
        auVar57._8_4_ = fVar159 * auVar88._8_4_;
        auVar57._12_4_ = fVar161 * auVar88._12_4_;
        auVar57._16_4_ = fVar163 * auVar88._16_4_;
        auVar57._20_4_ = fVar165 * auVar88._20_4_;
        auVar57._24_4_ = fVar167 * auVar88._24_4_;
        auVar57._28_4_ = auVar85._28_4_;
        auVar85 = vmulps_avx512vl(local_640,auVar96);
        auVar88 = vmulps_avx512vl(local_5e0,auVar96);
        auVar83 = vmulps_avx512vl(local_7a0,auVar96);
        auVar75 = vfmadd213ps_fma(auVar89,auVar57,auVar207);
        auVar93 = vsubps_avx(auVar85,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar90,auVar57,auVar94);
        auVar85 = vsubps_avx(auVar88,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar86,auVar57,auVar84);
        auVar88 = vsubps_avx512vl(auVar83,ZEXT1632(auVar75));
        auVar208 = ZEXT3264(auVar88);
        auVar184._8_4_ = 0x7f800000;
        auVar184._0_8_ = 0x7f8000007f800000;
        auVar184._12_4_ = 0x7f800000;
        auVar184._16_4_ = 0x7f800000;
        auVar184._20_4_ = 0x7f800000;
        auVar184._24_4_ = 0x7f800000;
        auVar184._28_4_ = 0x7f800000;
        auVar88 = vblendmps_avx512vl(auVar184,auVar82);
        bVar13 = (bool)((byte)uVar71 & 1);
        auVar118._0_4_ = (uint)bVar13 * auVar88._0_4_ | (uint)!bVar13 * auVar78._0_4_;
        bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar78._4_4_;
        bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar78._8_4_;
        bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar78._12_4_;
        iVar1 = (uint)((byte)(uVar71 >> 4) & 1) * auVar88._16_4_;
        auVar118._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar71 >> 5) & 1) * auVar88._20_4_;
        auVar118._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar71 >> 6) & 1) * auVar88._24_4_;
        auVar118._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar71 >> 7) * auVar88._28_4_;
        auVar118._28_4_ = iVar4;
        auVar185._8_4_ = 0xff800000;
        auVar185._0_8_ = 0xff800000ff800000;
        auVar185._12_4_ = 0xff800000;
        auVar185._16_4_ = 0xff800000;
        auVar185._20_4_ = 0xff800000;
        auVar185._24_4_ = 0xff800000;
        auVar185._28_4_ = 0xff800000;
        auVar88 = vblendmps_avx512vl(auVar185,auVar96);
        bVar13 = (bool)((byte)uVar71 & 1);
        auVar119._0_4_ = (uint)bVar13 * auVar88._0_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar119._16_4_ = (uint)bVar13 * auVar88._16_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar119._20_4_ = (uint)bVar13 * auVar88._20_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar119._24_4_ = (uint)bVar13 * auVar88._24_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = SUB81(uVar71 >> 7,0);
        auVar119._28_4_ = (uint)bVar13 * auVar88._28_4_ | (uint)!bVar13 * -0x800000;
        auVar40._8_4_ = 0x36000000;
        auVar40._0_8_ = 0x3600000036000000;
        auVar40._12_4_ = 0x36000000;
        auVar40._16_4_ = 0x36000000;
        auVar40._20_4_ = 0x36000000;
        auVar40._24_4_ = 0x36000000;
        auVar40._28_4_ = 0x36000000;
        auVar88 = vmulps_avx512vl(local_3a0,auVar40);
        uVar22 = vcmpps_avx512vl(auVar88,local_3c0,0xe);
        uVar71 = uVar71 & uVar22;
        bVar65 = (byte)uVar71;
        if (bVar65 != 0) {
          uVar22 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar76),2);
          auVar226._8_4_ = 0x7f800000;
          auVar226._0_8_ = 0x7f8000007f800000;
          auVar226._12_4_ = 0x7f800000;
          auVar226._16_4_ = 0x7f800000;
          auVar226._20_4_ = 0x7f800000;
          auVar226._24_4_ = 0x7f800000;
          auVar226._28_4_ = 0x7f800000;
          auVar235._8_4_ = 0xff800000;
          auVar235._0_8_ = 0xff800000ff800000;
          auVar235._12_4_ = 0xff800000;
          auVar235._16_4_ = 0xff800000;
          auVar235._20_4_ = 0xff800000;
          auVar235._24_4_ = 0xff800000;
          auVar235._28_4_ = 0xff800000;
          auVar89 = vblendmps_avx512vl(auVar226,auVar235);
          bVar12 = (byte)uVar22;
          uVar72 = (uint)(bVar12 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar88._0_4_;
          bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
          uVar123 = (uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar88._4_4_;
          bVar13 = (bool)((byte)(uVar22 >> 2) & 1);
          uVar124 = (uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar88._8_4_;
          bVar13 = (bool)((byte)(uVar22 >> 3) & 1);
          uVar125 = (uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar88._12_4_;
          bVar13 = (bool)((byte)(uVar22 >> 4) & 1);
          uVar126 = (uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar88._16_4_;
          bVar13 = (bool)((byte)(uVar22 >> 5) & 1);
          uVar127 = (uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar88._20_4_;
          bVar13 = (bool)((byte)(uVar22 >> 6) & 1);
          uVar128 = (uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar88._24_4_;
          bVar13 = SUB81(uVar22 >> 7,0);
          uVar129 = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar88._28_4_;
          auVar118._0_4_ = (bVar65 & 1) * uVar72 | !(bool)(bVar65 & 1) * auVar118._0_4_;
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar118._4_4_ = bVar13 * uVar123 | !bVar13 * auVar118._4_4_;
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar118._8_4_ = bVar13 * uVar124 | !bVar13 * auVar118._8_4_;
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar118._12_4_ = bVar13 * uVar125 | !bVar13 * auVar118._12_4_;
          bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar118._16_4_ = bVar13 * uVar126 | (uint)!bVar13 * iVar1;
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar118._20_4_ = bVar13 * uVar127 | (uint)!bVar13 * iVar2;
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar118._24_4_ = bVar13 * uVar128 | (uint)!bVar13 * iVar3;
          bVar13 = SUB81(uVar71 >> 7,0);
          auVar118._28_4_ = bVar13 * uVar129 | (uint)!bVar13 * iVar4;
          auVar88 = vblendmps_avx512vl(auVar235,auVar226);
          bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar22 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar22 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar22 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar22 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar22 >> 6) & 1);
          bVar20 = SUB81(uVar22 >> 7,0);
          auVar119._0_4_ =
               (uint)(bVar65 & 1) *
               ((uint)(bVar12 & 1) * auVar88._0_4_ | !(bool)(bVar12 & 1) * uVar72) |
               !(bool)(bVar65 & 1) * auVar119._0_4_;
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar119._4_4_ =
               (uint)bVar14 * ((uint)bVar13 * auVar88._4_4_ | !bVar13 * uVar123) |
               !bVar14 * auVar119._4_4_;
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar119._8_4_ =
               (uint)bVar13 * ((uint)bVar15 * auVar88._8_4_ | !bVar15 * uVar124) |
               !bVar13 * auVar119._8_4_;
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar119._12_4_ =
               (uint)bVar13 * ((uint)bVar16 * auVar88._12_4_ | !bVar16 * uVar125) |
               !bVar13 * auVar119._12_4_;
          bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar119._16_4_ =
               (uint)bVar13 * ((uint)bVar17 * auVar88._16_4_ | !bVar17 * uVar126) |
               !bVar13 * auVar119._16_4_;
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar119._20_4_ =
               (uint)bVar13 * ((uint)bVar18 * auVar88._20_4_ | !bVar18 * uVar127) |
               !bVar13 * auVar119._20_4_;
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar119._24_4_ =
               (uint)bVar13 * ((uint)bVar19 * auVar88._24_4_ | !bVar19 * uVar128) |
               !bVar13 * auVar119._24_4_;
          bVar13 = SUB81(uVar71 >> 7,0);
          auVar119._28_4_ =
               (uint)bVar13 * ((uint)bVar20 * auVar88._28_4_ | !bVar20 * uVar129) |
               !bVar13 * auVar119._28_4_;
          uVar70 = (ulong)(byte)((~bVar65 | bVar12) & (byte)uVar70);
        }
      }
      auVar249 = ZEXT3264(local_7a0);
      auVar253 = ZEXT3264(local_7c0);
      auVar240 = ZEXT3264(local_7e0);
      auVar241 = ZEXT3264(local_800);
      auVar244 = ZEXT3264(local_820);
      auVar246 = ZEXT3264(local_840);
      auVar251 = ZEXT3264(local_860);
      uVar131 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar221._4_4_ = uVar131;
      auVar221._0_4_ = uVar131;
      auVar221._8_4_ = uVar131;
      auVar221._12_4_ = uVar131;
      auVar221._16_4_ = uVar131;
      auVar221._20_4_ = uVar131;
      auVar221._24_4_ = uVar131;
      auVar221._28_4_ = uVar131;
      uVar131 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar227._4_4_ = uVar131;
      auVar227._0_4_ = uVar131;
      auVar227._8_4_ = uVar131;
      auVar227._12_4_ = uVar131;
      auVar227._16_4_ = uVar131;
      auVar227._20_4_ = uVar131;
      auVar227._24_4_ = uVar131;
      auVar227._28_4_ = uVar131;
      fVar190 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar222._0_4_ = fVar190 * auVar208._0_4_;
      auVar222._4_4_ = fVar190 * auVar208._4_4_;
      auVar222._8_4_ = fVar190 * auVar208._8_4_;
      auVar222._12_4_ = fVar190 * auVar208._12_4_;
      auVar222._16_4_ = fVar190 * auVar208._16_4_;
      auVar222._20_4_ = fVar190 * auVar208._20_4_;
      auVar222._28_36_ = auVar208._28_36_;
      auVar222._24_4_ = fVar190 * auVar208._24_4_;
      auVar75 = vfmadd231ps_fma(auVar222._0_32_,auVar227,auVar85);
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar221,auVar93);
      _local_2c0 = _local_4a0;
      local_2a0 = vminps_avx(local_260,auVar118);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar232._16_4_ = 0x7fffffff;
      auVar232._20_4_ = 0x7fffffff;
      auVar232._24_4_ = 0x7fffffff;
      auVar232._28_4_ = 0x7fffffff;
      auVar85 = vandps_avx(auVar232,ZEXT1632(auVar75));
      _local_280 = vmaxps_avx(_local_4a0,auVar119);
      auVar217._8_4_ = 0x3e99999a;
      auVar217._0_8_ = 0x3e99999a3e99999a;
      auVar217._12_4_ = 0x3e99999a;
      auVar217._16_4_ = 0x3e99999a;
      auVar217._20_4_ = 0x3e99999a;
      auVar217._24_4_ = 0x3e99999a;
      auVar217._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar85,auVar217,1);
      local_8f2 = (short)uVar21;
      uVar21 = vcmpps_avx512vl(_local_4a0,local_2a0,2);
      bVar65 = (byte)uVar21 & bVar62;
      _local_340 = _local_280;
      uVar23 = vcmpps_avx512vl(_local_280,local_260,2);
      auVar242 = ZEXT3264(local_680);
      auVar243 = ZEXT3264(local_6a0);
      if ((bVar62 & ((byte)uVar23 | (byte)uVar21)) == 0) {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar252 = ZEXT3264(auVar87);
        auVar229 = ZEXT3264(local_720);
        auVar231 = ZEXT3264(local_740);
        auVar233 = ZEXT3264(local_760);
        auVar236 = ZEXT3264(local_780);
        auVar222 = ZEXT3264(local_3e0);
        auVar208 = ZEXT3264(local_400);
      }
      else {
        auVar58._4_4_ = auVar230._4_4_ * fVar190;
        auVar58._0_4_ = auVar230._0_4_ * fVar190;
        auVar58._8_4_ = auVar230._8_4_ * fVar190;
        auVar58._12_4_ = auVar230._12_4_ * fVar190;
        auVar58._16_4_ = auVar230._16_4_ * fVar190;
        auVar58._20_4_ = auVar230._20_4_ * fVar190;
        fVar147 = local_280._28_4_;
        auVar58._24_4_ = auVar230._24_4_ * fVar190;
        auVar58._28_4_ = fVar147;
        auVar75 = vfmadd213ps_fma(auVar95,auVar227,auVar58);
        auVar75 = vfmadd213ps_fma(auVar91,auVar221,ZEXT1632(auVar75));
        auVar85 = vandps_avx(auVar232,ZEXT1632(auVar75));
        uVar21 = vcmpps_avx512vl(auVar85,auVar217,1);
        local_86c = (int)CONCAT71((int7)(uVar70 >> 8),~(byte)uVar70);
        bVar12 = (byte)uVar21 | ~(byte)uVar70;
        auVar143._8_4_ = 2;
        auVar143._0_8_ = 0x200000002;
        auVar143._12_4_ = 2;
        auVar143._16_4_ = 2;
        auVar143._20_4_ = 2;
        auVar143._24_4_ = 2;
        auVar143._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar85 = vpblendmd_avx512vl(auVar143,auVar41);
        local_240._0_4_ = (uint)(bVar12 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar12 & 1) * 2;
        bVar13 = (bool)(bVar12 >> 1 & 1);
        local_240._4_4_ = (uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar12 >> 2 & 1);
        local_240._8_4_ = (uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar12 >> 3 & 1);
        local_240._12_4_ = (uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar12 >> 4 & 1);
        local_240._16_4_ = (uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar12 >> 5 & 1);
        local_240._20_4_ = (uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar12 >> 6 & 1);
        local_240._24_4_ = (uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * 2;
        local_240._28_4_ = (uint)(bVar12 >> 7) * auVar85._28_4_ | (uint)!(bool)(bVar12 >> 7) * 2;
        local_2e0 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_2e0,local_240,5);
        local_868 = (uint)bVar65;
        bVar65 = (byte)uVar21 & bVar65;
        auVar229 = ZEXT3264(local_720);
        _local_360 = auVar104;
        if (bVar65 == 0) {
          fVar130 = (ray->super_RayK<1>).tfar;
          auVar145._4_4_ = fVar130;
          auVar145._0_4_ = fVar130;
          auVar145._8_4_ = fVar130;
          auVar145._12_4_ = fVar130;
          auVar145._16_4_ = fVar130;
          auVar145._20_4_ = fVar130;
          auVar145._24_4_ = fVar130;
          auVar145._28_4_ = fVar130;
          local_340._0_4_ = local_280._0_4_;
          local_340._4_4_ = local_280._4_4_;
          fStack_338 = local_280._8_4_;
          fStack_334 = local_280._12_4_;
          fStack_330 = local_280._16_4_;
          fStack_32c = local_280._20_4_;
          fStack_328 = local_280._24_4_;
          auVar231 = ZEXT3264(local_740);
          auVar233 = ZEXT3264(local_760);
          auVar236 = ZEXT3264(local_780);
          local_4a0._0_4_ = local_340._0_4_;
          local_4a0._4_4_ = local_340._4_4_;
          fStack_498 = fStack_338;
          fStack_494 = fStack_334;
          fStack_490 = fStack_330;
          fStack_48c = fStack_32c;
          fStack_488 = fStack_328;
          fStack_484 = fVar147;
        }
        else {
          auVar76 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar75 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar73 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar77 = vminps_avx(auVar76,auVar73);
          auVar76 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar73 = vmaxps_avx(auVar75,auVar76);
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar77,auVar168);
          auVar76 = vandps_avx(auVar73,auVar168);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar147 = auVar75._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar73,auVar73,0xff);
          local_320 = (float)local_4a0._0_4_ + (float)local_5a0._0_4_;
          fStack_31c = (float)local_4a0._4_4_ + (float)local_5a0._4_4_;
          fStack_318 = fStack_498 + fStack_598;
          fStack_314 = fStack_494 + fStack_594;
          fStack_310 = fStack_490 + fStack_590;
          fStack_30c = fStack_48c + fStack_58c;
          fStack_308 = fStack_488 + fStack_588;
          fStack_304 = fStack_484 + fStack_584;
          _local_4a0 = auVar87;
          do {
            auVar88 = _local_8e0;
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar87 = vblendmps_avx512vl(auVar144,_local_4a0);
            auVar121._0_4_ =
                 (uint)(bVar65 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 1 & 1);
            auVar121._4_4_ = (uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 2 & 1);
            auVar121._8_4_ = (uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 3 & 1);
            auVar121._12_4_ = (uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 4 & 1);
            auVar121._16_4_ = (uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 5 & 1);
            auVar121._20_4_ = (uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 6 & 1);
            auVar121._24_4_ = (uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * 0x7f800000;
            auVar121._28_4_ =
                 (uint)(bVar65 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar65 >> 7) * 0x7f800000;
            auVar87 = vshufps_avx(auVar121,auVar121,0xb1);
            auVar87 = vminps_avx(auVar121,auVar87);
            auVar85 = vshufpd_avx(auVar87,auVar87,5);
            auVar87 = vminps_avx(auVar87,auVar85);
            auVar85 = vpermpd_avx2(auVar87,0x4e);
            auVar87 = vminps_avx(auVar87,auVar85);
            uVar21 = vcmpps_avx512vl(auVar121,auVar87,0);
            bVar63 = (byte)uVar21 & bVar65;
            bVar12 = bVar65;
            if (bVar63 != 0) {
              bVar12 = bVar63;
            }
            iVar1 = 0;
            for (uVar72 = (uint)bVar12; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            local_540._0_16_ = (undefined1  [16])aVar5;
            auVar75 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar65;
              stack0xfffffffffffff722 = auVar88._2_30_;
              local_700._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
              local_660._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar1 << 2)));
              fVar130 = sqrtf(auVar75._0_4_);
              bVar65 = local_8e0[0];
              auVar75 = local_660._0_16_;
              auVar76 = local_700._0_16_;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar130 = auVar75._0_4_;
              auVar75 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar1 << 2)));
              auVar76 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
            }
            auVar75 = vinsertps_avx(auVar75,auVar76,0x10);
            lVar67 = 5;
            do {
              uVar131 = auVar75._0_4_;
              auVar135._4_4_ = uVar131;
              auVar135._0_4_ = uVar131;
              auVar135._8_4_ = uVar131;
              auVar135._12_4_ = uVar131;
              auVar73 = vfmadd132ps_fma(auVar135,ZEXT816(0) << 0x40,local_540._0_16_);
              auVar76 = vmovshdup_avx(auVar75);
              local_3a0._0_16_ = auVar76;
              fVar164 = 1.0 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar75,auVar75,0x55);
              fVar158 = auVar76._0_4_;
              auVar169._0_4_ = local_460._0_4_ * fVar158;
              fVar160 = auVar76._4_4_;
              auVar169._4_4_ = local_460._4_4_ * fVar160;
              fVar132 = auVar76._8_4_;
              auVar169._8_4_ = local_460._8_4_ * fVar132;
              fVar162 = auVar76._12_4_;
              auVar169._12_4_ = local_460._12_4_ * fVar162;
              local_380._0_16_ = ZEXT416((uint)fVar164);
              auVar191._4_4_ = fVar164;
              auVar191._0_4_ = fVar164;
              auVar191._8_4_ = fVar164;
              auVar191._12_4_ = fVar164;
              auVar76 = vfmadd231ps_fma(auVar169,auVar191,local_420._0_16_);
              auVar203._0_4_ = local_440._0_4_ * fVar158;
              auVar203._4_4_ = local_440._4_4_ * fVar160;
              auVar203._8_4_ = local_440._8_4_ * fVar132;
              auVar203._12_4_ = local_440._12_4_ * fVar162;
              auVar77 = vfmadd231ps_fma(auVar203,auVar191,local_460._0_16_);
              auVar212._0_4_ = fVar158 * (float)local_480._0_4_;
              auVar212._4_4_ = fVar160 * (float)local_480._4_4_;
              auVar212._8_4_ = fVar132 * fStack_478;
              auVar212._12_4_ = fVar162 * fStack_474;
              auVar79 = vfmadd231ps_fma(auVar212,auVar191,local_440._0_16_);
              auVar218._0_4_ = fVar158 * auVar77._0_4_;
              auVar218._4_4_ = fVar160 * auVar77._4_4_;
              auVar218._8_4_ = fVar132 * auVar77._8_4_;
              auVar218._12_4_ = fVar162 * auVar77._12_4_;
              auVar76 = vfmadd231ps_fma(auVar218,auVar191,auVar76);
              auVar170._0_4_ = fVar158 * auVar79._0_4_;
              auVar170._4_4_ = fVar160 * auVar79._4_4_;
              auVar170._8_4_ = fVar132 * auVar79._8_4_;
              auVar170._12_4_ = fVar162 * auVar79._12_4_;
              auVar77 = vfmadd231ps_fma(auVar170,auVar191,auVar77);
              auVar204._0_4_ = fVar158 * auVar77._0_4_;
              auVar204._4_4_ = fVar160 * auVar77._4_4_;
              auVar204._8_4_ = fVar132 * auVar77._8_4_;
              auVar204._12_4_ = fVar162 * auVar77._12_4_;
              auVar79 = vfmadd231ps_fma(auVar204,auVar76,auVar191);
              auVar76 = vsubps_avx(auVar77,auVar76);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar77 = vmulps_avx512vl(auVar76,auVar25);
              _local_360 = auVar79;
              auVar76 = vsubps_avx(auVar73,auVar79);
              _local_8e0 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_700._0_16_ = auVar77;
              local_660._0_16_ = auVar76;
              local_560._0_16_ = auVar75;
              if (auVar76._0_4_ < 0.0) {
                auVar229._0_4_ = sqrtf(auVar76._0_4_);
                auVar229._4_60_ = extraout_var;
                auVar75 = auVar229._0_16_;
                auVar77 = local_700._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar76,auVar76);
              }
              local_3c0._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
              fVar160 = local_3c0._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar160;
              local_5c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              fVar158 = local_5c0._0_4_ * 1.5;
              local_4c0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar73 = vxorps_avx512vl(local_3c0._0_16_,auVar26);
              auVar76 = vfnmadd213ss_fma(local_4c0,local_3c0._0_16_,ZEXT416(0x40000000));
              local_580._0_4_ = auVar75._0_4_;
              if (fVar160 < auVar73._0_4_) {
                local_8b0._0_4_ = fVar158;
                fVar132 = sqrtf(fVar160);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar77 = local_700._0_16_;
              }
              else {
                auVar73 = vsqrtss_avx(local_3c0._0_16_,local_3c0._0_16_);
                fVar132 = auVar73._0_4_;
                local_8b0._0_4_ = fVar158;
              }
              fVar158 = local_5c0._0_4_;
              fVar158 = (float)local_8b0._0_4_ + fVar160 * -0.5 * fVar158 * fVar158 * fVar158;
              local_8b0._0_4_ = auVar77._0_4_ * fVar158;
              local_8b0._4_4_ = auVar77._4_4_ * fVar158;
              fStack_8a8 = auVar77._8_4_ * fVar158;
              fStack_8a4 = auVar77._12_4_ * fVar158;
              local_5c0._0_16_ = vdpps_avx(_local_8b0,_local_8e0,0x7f);
              auVar78 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar136._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
              auVar136._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
              auVar136._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
              auVar136._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
              auVar73 = vsubps_avx(local_660._0_16_,auVar136);
              fVar160 = auVar73._0_4_;
              auVar148._4_12_ = ZEXT812(0) << 0x20;
              auVar148._0_4_ = fVar160;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar148);
              auVar74 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
              uVar69 = fVar160 == 0.0;
              uVar68 = fVar160 < 0.0;
              if ((bool)uVar68) {
                local_4e0._0_4_ = auVar80._0_4_;
                local_4f0 = fVar158;
                fStack_4ec = fVar158;
                fStack_4e8 = fVar158;
                fStack_4e4 = fVar158;
                local_4d0 = auVar79;
                fVar160 = sqrtf(fVar160);
                auVar80 = ZEXT416((uint)local_4e0._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar79 = local_4d0;
                auVar77 = local_700._0_16_;
                fVar158 = local_4f0;
                fVar162 = fStack_4ec;
                fVar164 = fStack_4e8;
                fVar166 = fStack_4e4;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar160 = auVar73._0_4_;
                fVar162 = fVar158;
                fVar164 = fVar158;
                fVar166 = fVar158;
              }
              auVar247 = ZEXT3264(local_640);
              auVar250 = ZEXT3264(local_5e0);
              auVar249 = ZEXT3264(local_7a0);
              auVar231 = ZEXT3264(local_740);
              auVar233 = ZEXT3264(local_760);
              auVar236 = ZEXT3264(local_780);
              auVar253 = ZEXT3264(local_7c0);
              auVar240 = ZEXT3264(local_7e0);
              auVar241 = ZEXT3264(local_800);
              auVar242 = ZEXT3264(local_680);
              auVar243 = ZEXT3264(local_6a0);
              auVar244 = ZEXT3264(local_820);
              auVar245 = ZEXT3264(local_6c0);
              auVar246 = ZEXT3264(local_840);
              auVar248 = ZEXT3264(local_6e0);
              auVar251 = ZEXT3264(local_860);
              auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_380._0_16_,
                                       local_3a0._0_16_);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                        local_380._0_16_);
              fVar190 = auVar73._0_4_ * 6.0;
              fVar157 = local_3a0._0_4_ * 6.0;
              auVar192._0_4_ = fVar157 * (float)local_480._0_4_;
              auVar192._4_4_ = fVar157 * (float)local_480._4_4_;
              auVar192._8_4_ = fVar157 * fStack_478;
              auVar192._12_4_ = fVar157 * fStack_474;
              auVar172._4_4_ = fVar190;
              auVar172._0_4_ = fVar190;
              auVar172._8_4_ = fVar190;
              auVar172._12_4_ = fVar190;
              auVar73 = vfmadd132ps_fma(auVar172,auVar192,local_440._0_16_);
              fVar190 = auVar7._0_4_ * 6.0;
              auVar149._4_4_ = fVar190;
              auVar149._0_4_ = fVar190;
              auVar149._8_4_ = fVar190;
              auVar149._12_4_ = fVar190;
              auVar73 = vfmadd132ps_fma(auVar149,auVar73,local_460._0_16_);
              fVar190 = local_380._0_4_ * 6.0;
              auVar173._4_4_ = fVar190;
              auVar173._0_4_ = fVar190;
              auVar173._8_4_ = fVar190;
              auVar173._12_4_ = fVar190;
              auVar73 = vfmadd132ps_fma(auVar173,auVar73,local_420._0_16_);
              auVar150._0_4_ = auVar73._0_4_ * (float)local_3c0._0_4_;
              auVar150._4_4_ = auVar73._4_4_ * (float)local_3c0._0_4_;
              auVar150._8_4_ = auVar73._8_4_ * (float)local_3c0._0_4_;
              auVar150._12_4_ = auVar73._12_4_ * (float)local_3c0._0_4_;
              auVar73 = vdpps_avx(auVar77,auVar73,0x7f);
              fVar190 = auVar73._0_4_;
              auVar174._0_4_ = auVar77._0_4_ * fVar190;
              auVar174._4_4_ = auVar77._4_4_ * fVar190;
              auVar174._8_4_ = auVar77._8_4_ * fVar190;
              auVar174._12_4_ = auVar77._12_4_ * fVar190;
              auVar73 = vsubps_avx(auVar150,auVar174);
              fVar190 = auVar76._0_4_ * (float)local_4c0._0_4_;
              auVar7 = vmaxss_avx(ZEXT416((uint)fVar147),
                                  ZEXT416((uint)(local_560._0_4_ * fVar130 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar77,auVar27);
              auVar175._0_4_ = fVar158 * auVar73._0_4_ * fVar190;
              auVar175._4_4_ = fVar162 * auVar73._4_4_ * fVar190;
              auVar175._8_4_ = fVar164 * auVar73._8_4_ * fVar190;
              auVar175._12_4_ = fVar166 * auVar73._12_4_ * fVar190;
              auVar76 = vdpps_avx(auVar81,_local_8b0,0x7f);
              auVar73 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar147),auVar7);
              auVar75 = vdpps_avx(_local_8e0,auVar175,0x7f);
              vfmadd213ss_avx512f(auVar78,ZEXT416((uint)(fVar147 / fVar132)),auVar73);
              fVar158 = auVar76._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_540._0_16_,_local_8b0,0x7f);
              auVar76 = vdpps_avx(_local_8e0,auVar81,0x7f);
              auVar73 = vmulss_avx512f(auVar80,auVar79);
              auVar79 = vmulss_avx512f(auVar79,auVar79);
              auVar78 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar73._0_4_ * auVar79._0_4_)));
              auVar73 = vdpps_avx(_local_8e0,local_540._0_16_,0x7f);
              auVar74 = vfnmadd231ss_avx512f(auVar76,local_5c0._0_16_,ZEXT416((uint)fVar158));
              auVar73 = vfnmadd231ss_avx512f(auVar73,local_5c0._0_16_,auVar75);
              auVar76 = vpermilps_avx(_local_360,0xff);
              fVar160 = fVar160 - auVar76._0_4_;
              auVar79 = vshufps_avx(auVar77,auVar77,0xff);
              auVar76 = vfmsub213ss_fma(auVar74,auVar78,auVar79);
              auVar224._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar73 = ZEXT416((uint)(auVar73._0_4_ * auVar78._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                        ZEXT416((uint)fVar158),auVar73);
              auVar76 = vinsertps_avx(auVar224,auVar73,0x1c);
              auVar213._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar213._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar213._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar73 = vinsertps_avx(ZEXT416((uint)fVar158),auVar213,0x10);
              auVar193._0_4_ = auVar78._0_4_;
              auVar193._4_4_ = auVar193._0_4_;
              auVar193._8_4_ = auVar193._0_4_;
              auVar193._12_4_ = auVar193._0_4_;
              auVar75 = vdivps_avx(auVar76,auVar193);
              auVar76 = vdivps_avx(auVar73,auVar193);
              auVar73 = vbroadcastss_avx512vl(local_5c0._0_16_);
              auVar194._0_4_ = auVar73._0_4_ * auVar75._0_4_ + fVar160 * auVar76._0_4_;
              auVar194._4_4_ = auVar73._4_4_ * auVar75._4_4_ + fVar160 * auVar76._4_4_;
              auVar194._8_4_ = auVar73._8_4_ * auVar75._8_4_ + fVar160 * auVar76._8_4_;
              auVar194._12_4_ = auVar73._12_4_ * auVar75._12_4_ + fVar160 * auVar76._12_4_;
              auVar75 = vsubps_avx(local_560._0_16_,auVar194);
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(local_5c0._0_16_,auVar28);
              auVar76 = vucomiss_avx512f(auVar76);
              if (!(bool)uVar68 && !(bool)uVar69) {
                auVar76 = vaddss_avx512f(auVar7,auVar76);
                auVar76 = vfmadd231ss_fma(auVar76,local_500,ZEXT416(0x36000000));
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar160),auVar29);
                if (auVar73._0_4_ < auVar76._0_4_) {
                  fVar130 = auVar75._0_4_ + (float)local_510._0_4_;
                  auVar229 = ZEXT3264(local_720);
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar130) &&
                     (fVar158 = (ray->super_RayK<1>).tfar, fVar130 <= fVar158)) {
                    auVar75 = vmovshdup_avx(auVar75);
                    fVar160 = auVar75._0_4_;
                    if ((0.0 <= fVar160) && (fVar160 <= 1.0)) {
                      auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_660._0_4_)
                                                  );
                      fVar132 = auVar75._0_4_;
                      pGVar9 = (context->scene->geometries).items[local_8f0].ptr;
                      if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar132 = fVar132 * 1.5 +
                                  (float)local_660._0_4_ * -0.5 * fVar132 * fVar132 * fVar132;
                        auVar195._0_4_ = fVar132 * (float)local_8e0._0_4_;
                        auVar195._4_4_ = fVar132 * (float)local_8e0._4_4_;
                        auVar195._8_4_ = fVar132 * fStack_8d8;
                        auVar195._12_4_ = fVar132 * fStack_8d4;
                        auVar79 = vfmadd213ps_fma(auVar79,auVar195,auVar77);
                        auVar75 = vshufps_avx(auVar195,auVar195,0xc9);
                        auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar196._0_4_ = auVar195._0_4_ * auVar76._0_4_;
                        auVar196._4_4_ = auVar195._4_4_ * auVar76._4_4_;
                        auVar196._8_4_ = auVar195._8_4_ * auVar76._8_4_;
                        auVar196._12_4_ = auVar195._12_4_ * auVar76._12_4_;
                        auVar73 = vfmsub231ps_fma(auVar196,auVar77,auVar75);
                        auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar76 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                        auVar137._0_4_ = auVar79._0_4_ * auVar73._0_4_;
                        auVar137._4_4_ = auVar79._4_4_ * auVar73._4_4_;
                        auVar137._8_4_ = auVar79._8_4_ * auVar73._8_4_;
                        auVar137._12_4_ = auVar79._12_4_ * auVar73._12_4_;
                        auVar75 = vfmsub231ps_fma(auVar137,auVar75,auVar76);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar130;
                          auVar76 = vshufps_avx(auVar75,auVar75,0xe9);
                          uVar21 = vmovlps_avx(auVar76);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                          (ray->Ng).field_0.field_0.z = auVar75._0_4_;
                          ray->u = fVar160;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8e8;
                          ray->geomID = (uint)local_8f0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8e0._0_4_ = fVar158;
                          auVar76 = vshufps_avx(auVar75,auVar75,0xe9);
                          local_610 = vmovlps_avx(auVar76);
                          local_608 = auVar75._0_4_;
                          local_604 = fVar160;
                          local_600 = 0;
                          local_5fc = (uint)local_8e8;
                          local_5f8 = (uint)local_8f0;
                          local_5f4 = context->user->instID[0];
                          local_5f0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar130;
                          local_8f8 = -1;
                          local_8a0.valid = &local_8f8;
                          local_8a0.geometryUserPtr = pGVar9->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_610;
                          local_8a0.N = 1;
                          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cd5fbf:
                            p_Var11 = context->args->filter;
                            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var11)(&local_8a0);
                              auVar251 = ZEXT3264(local_860);
                              auVar248 = ZEXT3264(local_6e0);
                              auVar246 = ZEXT3264(local_840);
                              auVar245 = ZEXT3264(local_6c0);
                              auVar244 = ZEXT3264(local_820);
                              auVar243 = ZEXT3264(local_6a0);
                              auVar242 = ZEXT3264(local_680);
                              auVar241 = ZEXT3264(local_800);
                              auVar240 = ZEXT3264(local_7e0);
                              auVar253 = ZEXT3264(local_7c0);
                              auVar236 = ZEXT3264(local_780);
                              auVar233 = ZEXT3264(local_760);
                              auVar231 = ZEXT3264(local_740);
                              auVar229 = ZEXT3264(local_720);
                              auVar249 = ZEXT3264(local_7a0);
                              auVar250 = ZEXT3264(local_5e0);
                              auVar247 = ZEXT3264(local_640);
                              if (*local_8a0.valid == 0) goto LAB_01cd60eb;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            (*pGVar9->intersectionFilterN)(&local_8a0);
                            auVar251 = ZEXT3264(local_860);
                            auVar248 = ZEXT3264(local_6e0);
                            auVar246 = ZEXT3264(local_840);
                            auVar245 = ZEXT3264(local_6c0);
                            auVar244 = ZEXT3264(local_820);
                            auVar243 = ZEXT3264(local_6a0);
                            auVar242 = ZEXT3264(local_680);
                            auVar241 = ZEXT3264(local_800);
                            auVar240 = ZEXT3264(local_7e0);
                            auVar253 = ZEXT3264(local_7c0);
                            auVar236 = ZEXT3264(local_780);
                            auVar233 = ZEXT3264(local_760);
                            auVar231 = ZEXT3264(local_740);
                            auVar229 = ZEXT3264(local_720);
                            auVar249 = ZEXT3264(local_7a0);
                            auVar250 = ZEXT3264(local_5e0);
                            auVar247 = ZEXT3264(local_640);
                            if (*local_8a0.valid != 0) goto LAB_01cd5fbf;
LAB_01cd60eb:
                            (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar67 = lVar67 + -1;
              auVar229 = ZEXT3264(local_720);
            } while (lVar67 != 0);
            fVar130 = (ray->super_RayK<1>).tfar;
            auVar145._4_4_ = fVar130;
            auVar145._0_4_ = fVar130;
            auVar145._8_4_ = fVar130;
            auVar145._12_4_ = fVar130;
            auVar145._16_4_ = fVar130;
            auVar145._20_4_ = fVar130;
            auVar145._24_4_ = fVar130;
            auVar145._28_4_ = fVar130;
            auVar59._4_4_ = fStack_31c;
            auVar59._0_4_ = local_320;
            auVar59._8_4_ = fStack_318;
            auVar59._12_4_ = fStack_314;
            auVar59._16_4_ = fStack_310;
            auVar59._20_4_ = fStack_30c;
            auVar59._24_4_ = fStack_308;
            auVar59._28_4_ = fStack_304;
            uVar21 = vcmpps_avx512vl(auVar145,auVar59,0xd);
            bVar65 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar65 & (byte)uVar21;
          } while (bVar65 != 0);
          fVar147 = fStack_324;
          local_4a0._0_4_ = local_280._0_4_;
          local_4a0._4_4_ = local_280._4_4_;
          fStack_498 = fStack_278;
          fStack_494 = fStack_274;
          fStack_490 = fStack_270;
          fStack_48c = fStack_26c;
          fStack_488 = fStack_268;
          fStack_484 = fStack_264;
        }
        bVar65 = (byte)local_8f2 | (byte)local_86c;
        auVar155._0_4_ = (float)local_5a0._0_4_ + (float)local_340._0_4_;
        auVar155._4_4_ = (float)local_5a0._4_4_ + (float)local_340._4_4_;
        auVar155._8_4_ = fStack_598 + fStack_338;
        auVar155._12_4_ = fStack_594 + fStack_334;
        auVar155._16_4_ = fStack_590 + fStack_330;
        auVar155._20_4_ = fStack_58c + fStack_32c;
        auVar155._24_4_ = fStack_588 + fStack_328;
        auVar155._28_4_ = fStack_584 + fVar147;
        uVar21 = vcmpps_avx512vl(auVar155,auVar145,2);
        bVar62 = (byte)uVar23 & bVar62 & (byte)uVar21;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar42._8_4_ = 3;
        auVar42._0_8_ = 0x300000003;
        auVar42._12_4_ = 3;
        auVar42._16_4_ = 3;
        auVar42._20_4_ = 3;
        auVar42._24_4_ = 3;
        auVar42._28_4_ = 3;
        auVar87 = vpblendmd_avx512vl(auVar156,auVar42);
        local_340._0_4_ = (uint)(bVar65 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
        bVar13 = (bool)(bVar65 >> 1 & 1);
        local_340._4_4_ = (uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar65 >> 2 & 1);
        fStack_338 = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * 2);
        bVar13 = (bool)(bVar65 >> 3 & 1);
        fStack_334 = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * 2);
        bVar13 = (bool)(bVar65 >> 4 & 1);
        fStack_330 = (float)((uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * 2);
        bVar13 = (bool)(bVar65 >> 5 & 1);
        fStack_32c = (float)((uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * 2);
        bVar13 = (bool)(bVar65 >> 6 & 1);
        fStack_328 = (float)((uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * 2);
        fStack_324 = (float)((uint)(bVar65 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2);
        uVar21 = vpcmpd_avx512vl(local_2e0,_local_340,5);
        bVar65 = (byte)uVar21 & bVar62;
        fVar147 = (float)local_5a0._0_4_;
        fVar130 = (float)local_5a0._4_4_;
        fVar158 = fStack_598;
        fVar160 = fStack_594;
        fVar132 = fStack_590;
        fVar162 = fStack_58c;
        fVar164 = fStack_588;
        fVar166 = fStack_584;
        if (bVar65 != 0) {
          auVar76 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar75 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar73 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar77 = vminps_avx(auVar76,auVar73);
          auVar76 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar73 = vmaxps_avx(auVar75,auVar76);
          auVar176._8_4_ = 0x7fffffff;
          auVar176._0_8_ = 0x7fffffff7fffffff;
          auVar176._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar77,auVar176);
          auVar76 = vandps_avx(auVar73,auVar176);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar147 = auVar75._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar73,auVar73,0xff);
          local_320 = (float)local_5a0._0_4_ + (float)local_4a0._0_4_;
          fStack_31c = (float)local_5a0._4_4_ + (float)local_4a0._4_4_;
          fStack_318 = fStack_598 + fStack_498;
          fStack_314 = fStack_594 + fStack_494;
          fStack_310 = fStack_590 + fStack_490;
          fStack_30c = fStack_58c + fStack_48c;
          fStack_308 = fStack_588 + fStack_488;
          fStack_304 = fStack_584 + fStack_484;
          do {
            auVar88 = _local_8e0;
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar87 = vblendmps_avx512vl(auVar146,_local_4a0);
            auVar122._0_4_ =
                 (uint)(bVar65 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 1 & 1);
            auVar122._4_4_ = (uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 2 & 1);
            auVar122._8_4_ = (uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 3 & 1);
            auVar122._12_4_ = (uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 4 & 1);
            auVar122._16_4_ = (uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 5 & 1);
            auVar122._20_4_ = (uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar65 >> 6 & 1);
            auVar122._24_4_ = (uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * 0x7f800000;
            auVar122._28_4_ =
                 (uint)(bVar65 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar65 >> 7) * 0x7f800000;
            auVar87 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar87 = vminps_avx(auVar122,auVar87);
            auVar85 = vshufpd_avx(auVar87,auVar87,5);
            auVar87 = vminps_avx(auVar87,auVar85);
            auVar85 = vpermpd_avx2(auVar87,0x4e);
            auVar87 = vminps_avx(auVar87,auVar85);
            uVar21 = vcmpps_avx512vl(auVar122,auVar87,0);
            bVar63 = (byte)uVar21 & bVar65;
            bVar12 = bVar65;
            if (bVar63 != 0) {
              bVar12 = bVar63;
            }
            iVar1 = 0;
            for (uVar72 = (uint)bVar12; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            local_540._0_16_ = (undefined1  [16])aVar5;
            auVar75 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar65;
              stack0xfffffffffffff722 = auVar88._2_30_;
              local_700._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
              local_660._0_16_ = ZEXT416(*(uint *)(local_260 + (uint)(iVar1 << 2)));
              fVar130 = sqrtf(auVar75._0_4_);
              bVar65 = local_8e0[0];
              auVar75 = local_660._0_16_;
              auVar76 = local_700._0_16_;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar130 = auVar75._0_4_;
              auVar75 = ZEXT416(*(uint *)(local_260 + (uint)(iVar1 << 2)));
              auVar76 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
            }
            auVar75 = vinsertps_avx(auVar75,auVar76,0x10);
            lVar67 = 5;
            do {
              uVar131 = auVar75._0_4_;
              auVar138._4_4_ = uVar131;
              auVar138._0_4_ = uVar131;
              auVar138._8_4_ = uVar131;
              auVar138._12_4_ = uVar131;
              auVar73 = vfmadd132ps_fma(auVar138,ZEXT816(0) << 0x40,local_540._0_16_);
              auVar76 = vmovshdup_avx(auVar75);
              local_3a0._0_16_ = auVar76;
              fVar164 = 1.0 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar75,auVar75,0x55);
              fVar158 = auVar76._0_4_;
              auVar177._0_4_ = local_460._0_4_ * fVar158;
              fVar160 = auVar76._4_4_;
              auVar177._4_4_ = local_460._4_4_ * fVar160;
              fVar132 = auVar76._8_4_;
              auVar177._8_4_ = local_460._8_4_ * fVar132;
              fVar162 = auVar76._12_4_;
              auVar177._12_4_ = local_460._12_4_ * fVar162;
              local_380._0_16_ = ZEXT416((uint)fVar164);
              auVar197._4_4_ = fVar164;
              auVar197._0_4_ = fVar164;
              auVar197._8_4_ = fVar164;
              auVar197._12_4_ = fVar164;
              auVar76 = vfmadd231ps_fma(auVar177,auVar197,local_420._0_16_);
              auVar205._0_4_ = local_440._0_4_ * fVar158;
              auVar205._4_4_ = local_440._4_4_ * fVar160;
              auVar205._8_4_ = local_440._8_4_ * fVar132;
              auVar205._12_4_ = local_440._12_4_ * fVar162;
              auVar77 = vfmadd231ps_fma(auVar205,auVar197,local_460._0_16_);
              auVar214._0_4_ = fVar158 * (float)local_480._0_4_;
              auVar214._4_4_ = fVar160 * (float)local_480._4_4_;
              auVar214._8_4_ = fVar132 * fStack_478;
              auVar214._12_4_ = fVar162 * fStack_474;
              auVar79 = vfmadd231ps_fma(auVar214,auVar197,local_440._0_16_);
              auVar219._0_4_ = fVar158 * auVar77._0_4_;
              auVar219._4_4_ = fVar160 * auVar77._4_4_;
              auVar219._8_4_ = fVar132 * auVar77._8_4_;
              auVar219._12_4_ = fVar162 * auVar77._12_4_;
              auVar76 = vfmadd231ps_fma(auVar219,auVar197,auVar76);
              auVar178._0_4_ = fVar158 * auVar79._0_4_;
              auVar178._4_4_ = fVar160 * auVar79._4_4_;
              auVar178._8_4_ = fVar132 * auVar79._8_4_;
              auVar178._12_4_ = fVar162 * auVar79._12_4_;
              auVar77 = vfmadd231ps_fma(auVar178,auVar197,auVar77);
              auVar206._0_4_ = fVar158 * auVar77._0_4_;
              auVar206._4_4_ = fVar160 * auVar77._4_4_;
              auVar206._8_4_ = fVar132 * auVar77._8_4_;
              auVar206._12_4_ = fVar162 * auVar77._12_4_;
              auVar79 = vfmadd231ps_fma(auVar206,auVar76,auVar197);
              auVar76 = vsubps_avx(auVar77,auVar76);
              auVar30._8_4_ = 0x40400000;
              auVar30._0_8_ = 0x4040000040400000;
              auVar30._12_4_ = 0x40400000;
              auVar77 = vmulps_avx512vl(auVar76,auVar30);
              _local_360 = auVar79;
              auVar76 = vsubps_avx(auVar73,auVar79);
              _local_8e0 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_700._0_16_ = auVar77;
              local_660._0_16_ = auVar76;
              local_560._0_16_ = auVar75;
              if (auVar76._0_4_ < 0.0) {
                auVar231._0_4_ = sqrtf(auVar76._0_4_);
                auVar231._4_60_ = extraout_var_00;
                auVar75 = auVar231._0_16_;
                auVar77 = local_700._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar76,auVar76);
              }
              local_3c0._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
              fVar160 = local_3c0._0_4_;
              auVar179._4_12_ = ZEXT812(0) << 0x20;
              auVar179._0_4_ = fVar160;
              local_5c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              fVar158 = local_5c0._0_4_ * 1.5;
              local_4c0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar73 = vxorps_avx512vl(local_3c0._0_16_,auVar31);
              auVar76 = vfnmadd213ss_fma(local_4c0,local_3c0._0_16_,ZEXT416(0x40000000));
              local_580._0_4_ = auVar75._0_4_;
              if (fVar160 < auVar73._0_4_) {
                local_8b0._0_4_ = fVar158;
                fVar132 = sqrtf(fVar160);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar77 = local_700._0_16_;
              }
              else {
                auVar73 = vsqrtss_avx(local_3c0._0_16_,local_3c0._0_16_);
                fVar132 = auVar73._0_4_;
                local_8b0._0_4_ = fVar158;
              }
              fVar158 = local_5c0._0_4_;
              local_8b0._4_4_ =
                   (float)local_8b0._0_4_ + fVar160 * -0.5 * fVar158 * fVar158 * fVar158;
              local_8b0._0_4_ = local_8b0._4_4_;
              fStack_8a8 = (float)local_8b0._4_4_;
              fStack_8a4 = (float)local_8b0._4_4_;
              auVar239._0_4_ = auVar77._0_4_ * (float)local_8b0._4_4_;
              auVar239._4_4_ = auVar77._4_4_ * (float)local_8b0._4_4_;
              auVar239._8_4_ = auVar77._8_4_ * (float)local_8b0._4_4_;
              auVar239._12_4_ = auVar77._12_4_ * (float)local_8b0._4_4_;
              local_5c0._0_16_ = vdpps_avx(auVar239,_local_8e0,0x7f);
              auVar78 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar139._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
              auVar139._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
              auVar139._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
              auVar139._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
              auVar73 = vsubps_avx(local_660._0_16_,auVar139);
              fVar158 = auVar73._0_4_;
              auVar151._4_12_ = ZEXT812(0) << 0x20;
              auVar151._0_4_ = fVar158;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
              auVar74 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
              uVar69 = fVar158 == 0.0;
              uVar68 = fVar158 < 0.0;
              if ((bool)uVar68) {
                local_4f0 = auVar80._0_4_;
                local_4e0 = auVar239;
                local_4d0 = auVar79;
                fVar158 = sqrtf(fVar158);
                auVar80 = ZEXT416((uint)local_4f0);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar239 = local_4e0;
                auVar79 = local_4d0;
                auVar77 = local_700._0_16_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar158 = auVar73._0_4_;
              }
              auVar247 = ZEXT3264(local_640);
              auVar250 = ZEXT3264(local_5e0);
              auVar249 = ZEXT3264(local_7a0);
              auVar231 = ZEXT3264(local_740);
              auVar233 = ZEXT3264(local_760);
              auVar236 = ZEXT3264(local_780);
              auVar253 = ZEXT3264(local_7c0);
              auVar240 = ZEXT3264(local_7e0);
              auVar241 = ZEXT3264(local_800);
              auVar242 = ZEXT3264(local_680);
              auVar243 = ZEXT3264(local_6a0);
              auVar244 = ZEXT3264(local_820);
              auVar245 = ZEXT3264(local_6c0);
              auVar246 = ZEXT3264(local_840);
              auVar248 = ZEXT3264(local_6e0);
              auVar251 = ZEXT3264(local_860);
              auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_380._0_16_,
                                       local_3a0._0_16_);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                        local_380._0_16_);
              fVar160 = auVar73._0_4_ * 6.0;
              fVar162 = local_3a0._0_4_ * 6.0;
              auVar198._0_4_ = fVar162 * (float)local_480._0_4_;
              auVar198._4_4_ = fVar162 * (float)local_480._4_4_;
              auVar198._8_4_ = fVar162 * fStack_478;
              auVar198._12_4_ = fVar162 * fStack_474;
              auVar180._4_4_ = fVar160;
              auVar180._0_4_ = fVar160;
              auVar180._8_4_ = fVar160;
              auVar180._12_4_ = fVar160;
              auVar73 = vfmadd132ps_fma(auVar180,auVar198,local_440._0_16_);
              fVar160 = auVar7._0_4_ * 6.0;
              auVar152._4_4_ = fVar160;
              auVar152._0_4_ = fVar160;
              auVar152._8_4_ = fVar160;
              auVar152._12_4_ = fVar160;
              auVar73 = vfmadd132ps_fma(auVar152,auVar73,local_460._0_16_);
              fVar160 = local_380._0_4_ * 6.0;
              auVar181._4_4_ = fVar160;
              auVar181._0_4_ = fVar160;
              auVar181._8_4_ = fVar160;
              auVar181._12_4_ = fVar160;
              auVar73 = vfmadd132ps_fma(auVar181,auVar73,local_420._0_16_);
              auVar153._0_4_ = auVar73._0_4_ * (float)local_3c0._0_4_;
              auVar153._4_4_ = auVar73._4_4_ * (float)local_3c0._0_4_;
              auVar153._8_4_ = auVar73._8_4_ * (float)local_3c0._0_4_;
              auVar153._12_4_ = auVar73._12_4_ * (float)local_3c0._0_4_;
              auVar73 = vdpps_avx(auVar77,auVar73,0x7f);
              fVar160 = auVar73._0_4_;
              auVar182._0_4_ = auVar77._0_4_ * fVar160;
              auVar182._4_4_ = auVar77._4_4_ * fVar160;
              auVar182._8_4_ = auVar77._8_4_ * fVar160;
              auVar182._12_4_ = auVar77._12_4_ * fVar160;
              auVar73 = vsubps_avx(auVar153,auVar182);
              fVar160 = auVar76._0_4_ * (float)local_4c0._0_4_;
              auVar7 = vmaxss_avx(ZEXT416((uint)fVar147),
                                  ZEXT416((uint)(local_560._0_4_ * fVar130 * 1.9073486e-06)));
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar77,auVar32);
              auVar183._0_4_ = auVar73._0_4_ * fVar160 * (float)local_8b0._0_4_;
              auVar183._4_4_ = auVar73._4_4_ * fVar160 * (float)local_8b0._4_4_;
              auVar183._8_4_ = auVar73._8_4_ * fVar160 * fStack_8a8;
              auVar183._12_4_ = auVar73._12_4_ * fVar160 * fStack_8a4;
              auVar76 = vdpps_avx(auVar81,auVar239,0x7f);
              auVar73 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar147),auVar7);
              auVar75 = vdpps_avx(_local_8e0,auVar183,0x7f);
              vfmadd213ss_avx512f(auVar78,ZEXT416((uint)(fVar147 / fVar132)),auVar73);
              fVar160 = auVar76._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_540._0_16_,auVar239,0x7f);
              auVar76 = vdpps_avx(_local_8e0,auVar81,0x7f);
              auVar73 = vmulss_avx512f(auVar80,auVar79);
              auVar79 = vmulss_avx512f(auVar79,auVar79);
              auVar78 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar73._0_4_ * auVar79._0_4_)));
              auVar73 = vdpps_avx(_local_8e0,local_540._0_16_,0x7f);
              auVar74 = vfnmadd231ss_avx512f(auVar76,local_5c0._0_16_,ZEXT416((uint)fVar160));
              auVar73 = vfnmadd231ss_avx512f(auVar73,local_5c0._0_16_,auVar75);
              auVar76 = vpermilps_avx(_local_360,0xff);
              fVar158 = fVar158 - auVar76._0_4_;
              auVar79 = vshufps_avx(auVar77,auVar77,0xff);
              auVar76 = vfmsub213ss_fma(auVar74,auVar78,auVar79);
              auVar225._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar225._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar73 = ZEXT416((uint)(auVar73._0_4_ * auVar78._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                        ZEXT416((uint)fVar160),auVar73);
              auVar76 = vinsertps_avx(auVar225,auVar73,0x1c);
              auVar215._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar215._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar215._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar73 = vinsertps_avx(ZEXT416((uint)fVar160),auVar215,0x10);
              auVar199._0_4_ = auVar78._0_4_;
              auVar199._4_4_ = auVar199._0_4_;
              auVar199._8_4_ = auVar199._0_4_;
              auVar199._12_4_ = auVar199._0_4_;
              auVar75 = vdivps_avx(auVar76,auVar199);
              auVar76 = vdivps_avx(auVar73,auVar199);
              auVar73 = vbroadcastss_avx512vl(local_5c0._0_16_);
              auVar200._0_4_ = auVar73._0_4_ * auVar75._0_4_ + fVar158 * auVar76._0_4_;
              auVar200._4_4_ = auVar73._4_4_ * auVar75._4_4_ + fVar158 * auVar76._4_4_;
              auVar200._8_4_ = auVar73._8_4_ * auVar75._8_4_ + fVar158 * auVar76._8_4_;
              auVar200._12_4_ = auVar73._12_4_ * auVar75._12_4_ + fVar158 * auVar76._12_4_;
              auVar75 = vsubps_avx(local_560._0_16_,auVar200);
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(local_5c0._0_16_,auVar33);
              auVar76 = vucomiss_avx512f(auVar76);
              if (!(bool)uVar68 && !(bool)uVar69) {
                auVar76 = vaddss_avx512f(auVar7,auVar76);
                auVar76 = vfmadd231ss_fma(auVar76,local_500,ZEXT416(0x36000000));
                auVar34._8_4_ = 0x7fffffff;
                auVar34._0_8_ = 0x7fffffff7fffffff;
                auVar34._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar158),auVar34);
                if (auVar73._0_4_ < auVar76._0_4_) {
                  fVar130 = auVar75._0_4_ + (float)local_510._0_4_;
                  auVar229 = ZEXT3264(local_720);
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar130) &&
                     (fVar158 = (ray->super_RayK<1>).tfar, fVar130 <= fVar158)) {
                    auVar75 = vmovshdup_avx(auVar75);
                    fVar160 = auVar75._0_4_;
                    if ((0.0 <= fVar160) && (fVar160 <= 1.0)) {
                      auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_660._0_4_)
                                                  );
                      fVar132 = auVar75._0_4_;
                      pGVar9 = (context->scene->geometries).items[local_8f0].ptr;
                      if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar132 = fVar132 * 1.5 +
                                  (float)local_660._0_4_ * -0.5 * fVar132 * fVar132 * fVar132;
                        auVar201._0_4_ = fVar132 * (float)local_8e0._0_4_;
                        auVar201._4_4_ = fVar132 * (float)local_8e0._4_4_;
                        auVar201._8_4_ = fVar132 * fStack_8d8;
                        auVar201._12_4_ = fVar132 * fStack_8d4;
                        auVar79 = vfmadd213ps_fma(auVar79,auVar201,auVar77);
                        auVar75 = vshufps_avx(auVar201,auVar201,0xc9);
                        auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar202._0_4_ = auVar201._0_4_ * auVar76._0_4_;
                        auVar202._4_4_ = auVar201._4_4_ * auVar76._4_4_;
                        auVar202._8_4_ = auVar201._8_4_ * auVar76._8_4_;
                        auVar202._12_4_ = auVar201._12_4_ * auVar76._12_4_;
                        auVar73 = vfmsub231ps_fma(auVar202,auVar77,auVar75);
                        auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar76 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                        auVar140._0_4_ = auVar79._0_4_ * auVar73._0_4_;
                        auVar140._4_4_ = auVar79._4_4_ * auVar73._4_4_;
                        auVar140._8_4_ = auVar79._8_4_ * auVar73._8_4_;
                        auVar140._12_4_ = auVar79._12_4_ * auVar73._12_4_;
                        auVar75 = vfmsub231ps_fma(auVar140,auVar75,auVar76);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar130;
                          auVar76 = vshufps_avx(auVar75,auVar75,0xe9);
                          uVar21 = vmovlps_avx(auVar76);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                          (ray->Ng).field_0.field_0.z = auVar75._0_4_;
                          ray->u = fVar160;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8e8;
                          ray->geomID = (uint)local_8f0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8e0._0_4_ = fVar158;
                          auVar76 = vshufps_avx(auVar75,auVar75,0xe9);
                          local_610 = vmovlps_avx(auVar76);
                          local_608 = auVar75._0_4_;
                          local_604 = fVar160;
                          local_600 = 0;
                          local_5fc = (uint)local_8e8;
                          local_5f8 = (uint)local_8f0;
                          local_5f4 = context->user->instID[0];
                          local_5f0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar130;
                          local_8f8 = -1;
                          local_8a0.valid = &local_8f8;
                          local_8a0.geometryUserPtr = pGVar9->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_610;
                          local_8a0.N = 1;
                          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cd6ba8:
                            p_Var11 = context->args->filter;
                            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var11)(&local_8a0);
                              auVar251 = ZEXT3264(local_860);
                              auVar248 = ZEXT3264(local_6e0);
                              auVar246 = ZEXT3264(local_840);
                              auVar245 = ZEXT3264(local_6c0);
                              auVar244 = ZEXT3264(local_820);
                              auVar243 = ZEXT3264(local_6a0);
                              auVar242 = ZEXT3264(local_680);
                              auVar241 = ZEXT3264(local_800);
                              auVar240 = ZEXT3264(local_7e0);
                              auVar253 = ZEXT3264(local_7c0);
                              auVar236 = ZEXT3264(local_780);
                              auVar233 = ZEXT3264(local_760);
                              auVar231 = ZEXT3264(local_740);
                              auVar229 = ZEXT3264(local_720);
                              auVar249 = ZEXT3264(local_7a0);
                              auVar250 = ZEXT3264(local_5e0);
                              auVar247 = ZEXT3264(local_640);
                              if (*local_8a0.valid == 0) goto LAB_01cd6cd4;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            (*pGVar9->intersectionFilterN)(&local_8a0);
                            auVar251 = ZEXT3264(local_860);
                            auVar248 = ZEXT3264(local_6e0);
                            auVar246 = ZEXT3264(local_840);
                            auVar245 = ZEXT3264(local_6c0);
                            auVar244 = ZEXT3264(local_820);
                            auVar243 = ZEXT3264(local_6a0);
                            auVar242 = ZEXT3264(local_680);
                            auVar241 = ZEXT3264(local_800);
                            auVar240 = ZEXT3264(local_7e0);
                            auVar253 = ZEXT3264(local_7c0);
                            auVar236 = ZEXT3264(local_780);
                            auVar233 = ZEXT3264(local_760);
                            auVar231 = ZEXT3264(local_740);
                            auVar229 = ZEXT3264(local_720);
                            auVar249 = ZEXT3264(local_7a0);
                            auVar250 = ZEXT3264(local_5e0);
                            auVar247 = ZEXT3264(local_640);
                            if (*local_8a0.valid != 0) goto LAB_01cd6ba8;
LAB_01cd6cd4:
                            (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar67 = lVar67 + -1;
              auVar229 = ZEXT3264(local_720);
            } while (lVar67 != 0);
            fVar130 = (ray->super_RayK<1>).tfar;
            auVar145._4_4_ = fVar130;
            auVar145._0_4_ = fVar130;
            auVar145._8_4_ = fVar130;
            auVar145._12_4_ = fVar130;
            auVar145._16_4_ = fVar130;
            auVar145._20_4_ = fVar130;
            auVar145._24_4_ = fVar130;
            auVar145._28_4_ = fVar130;
            auVar60._4_4_ = fStack_31c;
            auVar60._0_4_ = local_320;
            auVar60._8_4_ = fStack_318;
            auVar60._12_4_ = fStack_314;
            auVar60._16_4_ = fStack_310;
            auVar60._20_4_ = fStack_30c;
            auVar60._24_4_ = fStack_308;
            auVar60._28_4_ = fStack_304;
            uVar21 = vcmpps_avx512vl(auVar145,auVar60,0xd);
            bVar65 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar65 & (byte)uVar21;
          } while (bVar65 != 0);
          local_4a0._0_4_ = local_280._0_4_;
          local_4a0._4_4_ = local_280._4_4_;
          fStack_498 = fStack_278;
          fStack_494 = fStack_274;
          fStack_490 = fStack_270;
          fStack_48c = fStack_26c;
          fStack_488 = fStack_268;
          fStack_484 = fStack_264;
          fVar147 = (float)local_5a0._0_4_;
          fVar130 = (float)local_5a0._4_4_;
          fVar158 = fStack_598;
          fVar160 = fStack_594;
          fVar132 = fStack_590;
          fVar162 = fStack_58c;
          fVar164 = fStack_588;
          fVar166 = fStack_584;
        }
        uVar23 = vpcmpgtd_avx512vl(_local_340,local_2e0);
        uVar24 = vpcmpd_avx512vl(local_2e0,local_240,1);
        auVar188._0_4_ = fVar147 + (float)local_2c0._0_4_;
        auVar188._4_4_ = fVar130 + (float)local_2c0._4_4_;
        auVar188._8_4_ = fVar158 + fStack_2b8;
        auVar188._12_4_ = fVar160 + fStack_2b4;
        auVar188._16_4_ = fVar132 + fStack_2b0;
        auVar188._20_4_ = fVar162 + fStack_2ac;
        auVar188._24_4_ = fVar164 + fStack_2a8;
        auVar188._28_4_ = fVar166 + fStack_2a4;
        uVar21 = vcmpps_avx512vl(auVar188,auVar145,2);
        bVar65 = (byte)local_868 & (byte)uVar24 & (byte)uVar21;
        auVar189._0_4_ = fVar147 + (float)local_4a0._0_4_;
        auVar189._4_4_ = fVar130 + (float)local_4a0._4_4_;
        auVar189._8_4_ = fVar158 + fStack_498;
        auVar189._12_4_ = fVar160 + fStack_494;
        auVar189._16_4_ = fVar132 + fStack_490;
        auVar189._20_4_ = fVar162 + fStack_48c;
        auVar189._24_4_ = fVar164 + fStack_488;
        auVar189._28_4_ = fVar166 + fStack_484;
        uVar21 = vcmpps_avx512vl(auVar189,auVar145,2);
        bVar62 = bVar62 & (byte)uVar23 & (byte)uVar21 | bVar65;
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar252 = ZEXT3264(auVar87);
        auVar222 = ZEXT3264(local_3e0);
        auVar208 = ZEXT3264(local_400);
        prim = local_4a8;
        if (bVar62 != 0) {
          abStack_180[uVar64 * 0x60] = bVar62;
          bVar13 = (bool)(bVar65 >> 1 & 1);
          bVar14 = (bool)(bVar65 >> 2 & 1);
          bVar15 = (bool)(bVar65 >> 3 & 1);
          bVar16 = (bool)(bVar65 >> 4 & 1);
          bVar17 = (bool)(bVar65 >> 5 & 1);
          bVar18 = (bool)(bVar65 >> 6 & 1);
          auStack_160[uVar64 * 0x18] =
               (uint)(bVar65 & 1) * local_2c0._0_4_ | (uint)!(bool)(bVar65 & 1) * local_4a0._0_4_;
          auStack_160[uVar64 * 0x18 + 1] =
               (uint)bVar13 * local_2c0._4_4_ | (uint)!bVar13 * local_4a0._4_4_;
          auStack_160[uVar64 * 0x18 + 2] =
               (uint)bVar14 * (int)fStack_2b8 | (uint)!bVar14 * (int)fStack_498;
          auStack_160[uVar64 * 0x18 + 3] =
               (uint)bVar15 * (int)fStack_2b4 | (uint)!bVar15 * (int)fStack_494;
          auStack_160[uVar64 * 0x18 + 4] =
               (uint)bVar16 * (int)fStack_2b0 | (uint)!bVar16 * (int)fStack_490;
          auStack_160[uVar64 * 0x18 + 5] =
               (uint)bVar17 * (int)fStack_2ac | (uint)!bVar17 * (int)fStack_48c;
          auStack_160[uVar64 * 0x18 + 6] =
               (uint)bVar18 * (int)fStack_2a8 | (uint)!bVar18 * (int)fStack_488;
          auStack_160[uVar64 * 0x18 + 7] =
               (uint)(bVar65 >> 7) * (int)fStack_2a4 | (uint)!(bool)(bVar65 >> 7) * (int)fStack_484;
          uVar70 = vmovlps_avx(local_2f0);
          (&uStack_140)[uVar64 * 0xc] = uVar70;
          aiStack_138[uVar64 * 0x18] = local_864 + 1;
          uVar64 = (ulong)((int)uVar64 + 1);
        }
      }
    }
    fVar190 = (ray->super_RayK<1>).tfar;
    auVar141._4_4_ = fVar190;
    auVar141._0_4_ = fVar190;
    auVar141._8_4_ = fVar190;
    auVar141._12_4_ = fVar190;
    auVar141._16_4_ = fVar190;
    auVar141._20_4_ = fVar190;
    auVar141._24_4_ = fVar190;
    auVar141._28_4_ = fVar190;
    do {
      uVar72 = (uint)uVar64;
      uVar64 = (ulong)(uVar72 - 1);
      if (uVar72 == 0) {
        uVar21 = vcmpps_avx512vl(auVar141,local_220,0xd);
        uVar72 = (uint)uVar21 & (uint)uVar66 - 1 & (uint)uVar66;
        uVar66 = (ulong)uVar72;
        if (uVar72 == 0) {
          return;
        }
        goto LAB_01cd4722;
      }
      auVar87 = *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x18);
      auVar186._0_4_ = fVar147 + auVar87._0_4_;
      auVar186._4_4_ = fVar130 + auVar87._4_4_;
      auVar186._8_4_ = fVar158 + auVar87._8_4_;
      auVar186._12_4_ = fVar160 + auVar87._12_4_;
      auVar186._16_4_ = fVar132 + auVar87._16_4_;
      auVar186._20_4_ = fVar162 + auVar87._20_4_;
      auVar186._24_4_ = fVar164 + auVar87._24_4_;
      auVar186._28_4_ = fVar166 + auVar87._28_4_;
      uVar21 = vcmpps_avx512vl(auVar186,auVar141,2);
      uVar123 = (uint)uVar21 & (uint)abStack_180[uVar64 * 0x60];
    } while (uVar123 == 0);
    uVar70 = (&uStack_140)[uVar64 * 0xc];
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar70;
    auVar187._8_4_ = 0x7f800000;
    auVar187._0_8_ = 0x7f8000007f800000;
    auVar187._12_4_ = 0x7f800000;
    auVar187._16_4_ = 0x7f800000;
    auVar187._20_4_ = 0x7f800000;
    auVar187._24_4_ = 0x7f800000;
    auVar187._28_4_ = 0x7f800000;
    auVar85 = vblendmps_avx512vl(auVar187,auVar87);
    bVar62 = (byte)uVar123;
    auVar120._0_4_ =
         (uint)(bVar62 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)auVar87._0_4_;
    bVar13 = (bool)((byte)(uVar123 >> 1) & 1);
    auVar120._4_4_ = (uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * (int)auVar87._4_4_;
    bVar13 = (bool)((byte)(uVar123 >> 2) & 1);
    auVar120._8_4_ = (uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * (int)auVar87._8_4_;
    bVar13 = (bool)((byte)(uVar123 >> 3) & 1);
    auVar120._12_4_ = (uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * (int)auVar87._12_4_;
    bVar13 = (bool)((byte)(uVar123 >> 4) & 1);
    auVar120._16_4_ = (uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * (int)auVar87._16_4_;
    bVar13 = (bool)((byte)(uVar123 >> 5) & 1);
    auVar120._20_4_ = (uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * (int)auVar87._20_4_;
    bVar13 = (bool)((byte)(uVar123 >> 6) & 1);
    auVar120._24_4_ = (uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * (int)auVar87._24_4_;
    auVar120._28_4_ =
         (uVar123 >> 7) * auVar85._28_4_ | (uint)!SUB41(uVar123 >> 7,0) * (int)auVar87._28_4_;
    auVar87 = vshufps_avx(auVar120,auVar120,0xb1);
    auVar87 = vminps_avx(auVar120,auVar87);
    auVar85 = vshufpd_avx(auVar87,auVar87,5);
    auVar87 = vminps_avx(auVar87,auVar85);
    auVar85 = vpermpd_avx2(auVar87,0x4e);
    auVar87 = vminps_avx(auVar87,auVar85);
    uVar21 = vcmpps_avx512vl(auVar120,auVar87,0);
    bVar65 = (byte)uVar21 & bVar62;
    if (bVar65 != 0) {
      uVar123 = (uint)bVar65;
    }
    uVar124 = 0;
    for (; (uVar123 & 1) == 0; uVar123 = uVar123 >> 1 | 0x80000000) {
      uVar124 = uVar124 + 1;
    }
    local_864 = aiStack_138[uVar64 * 0x18];
    bVar62 = ~('\x01' << ((byte)uVar124 & 0x1f)) & bVar62;
    abStack_180[uVar64 * 0x60] = bVar62;
    if (bVar62 == 0) {
      uVar72 = uVar72 - 1;
    }
    uVar131 = (undefined4)uVar70;
    auVar154._4_4_ = uVar131;
    auVar154._0_4_ = uVar131;
    auVar154._8_4_ = uVar131;
    auVar154._12_4_ = uVar131;
    auVar154._16_4_ = uVar131;
    auVar154._20_4_ = uVar131;
    auVar154._24_4_ = uVar131;
    auVar154._28_4_ = uVar131;
    auVar75 = vmovshdup_avx(auVar134);
    auVar75 = vsubps_avx(auVar75,auVar134);
    auVar142._0_4_ = auVar75._0_4_;
    auVar142._4_4_ = auVar142._0_4_;
    auVar142._8_4_ = auVar142._0_4_;
    auVar142._12_4_ = auVar142._0_4_;
    auVar142._16_4_ = auVar142._0_4_;
    auVar142._20_4_ = auVar142._0_4_;
    auVar142._24_4_ = auVar142._0_4_;
    auVar142._28_4_ = auVar142._0_4_;
    auVar75 = vfmadd132ps_fma(auVar142,auVar154,_DAT_01faff20);
    _local_2c0 = ZEXT1632(auVar75);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_2c0 + (ulong)uVar124 * 4);
    uVar64 = (ulong)uVar72;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }